

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  Primitive PVar9;
  uint uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  bool bVar73;
  bool bVar74;
  bool bVar75;
  bool bVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [28];
  undefined1 auVar101 [24];
  uint uVar102;
  int iVar103;
  uint uVar104;
  ulong uVar105;
  uint uVar106;
  ulong uVar107;
  ulong uVar108;
  long lVar109;
  undefined4 uVar110;
  undefined8 uVar111;
  float fVar135;
  vint4 bi_2;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar134;
  float fVar136;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar116 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar131 [32];
  undefined1 auVar119 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar158;
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar176 [64];
  vint4 ai_2;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  vint4 ai;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  vint4 bi;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  vint4 ai_1;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined4 uVar232;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar235;
  float fVar241;
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  float fVar242;
  float fVar247;
  float fVar248;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_920 [32];
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [32];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 (*local_708) [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  LinearSpace3fa *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  int local_480;
  int local_47c;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined1 local_420 [32];
  float local_400 [4];
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar175 [32];
  undefined1 auVar185 [32];
  undefined1 auVar221 [16];
  
  PVar9 = prim[1];
  uVar108 = (ulong)(byte)PVar9;
  fVar159 = *(float *)(prim + uVar108 * 0x19 + 0x12);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar13 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + uVar108 * 0x19 + 6));
  auVar112._0_4_ = fVar159 * auVar13._0_4_;
  auVar112._4_4_ = fVar159 * auVar13._4_4_;
  auVar112._8_4_ = fVar159 * auVar13._8_4_;
  auVar112._12_4_ = fVar159 * auVar13._12_4_;
  auVar194._0_4_ = fVar159 * auVar14._0_4_;
  auVar194._4_4_ = fVar159 * auVar14._4_4_;
  auVar194._8_4_ = fVar159 * auVar14._8_4_;
  auVar194._12_4_ = fVar159 * auVar14._12_4_;
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar108 * 4 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar108 * 5 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar108 * 6 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar108 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar108 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar105 = (ulong)(uint)((int)(uVar108 * 9) * 2);
  auVar115 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 + 6)));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 + uVar108 + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  uVar105 = (ulong)(uint)((int)(uVar108 * 5) << 2);
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 + 6)));
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar243._4_4_ = auVar194._0_4_;
  auVar243._0_4_ = auVar194._0_4_;
  auVar243._8_4_ = auVar194._0_4_;
  auVar243._12_4_ = auVar194._0_4_;
  auVar117 = vshufps_avx(auVar194,auVar194,0x55);
  auVar113 = vshufps_avx(auVar194,auVar194,0xaa);
  fVar159 = auVar113._0_4_;
  auVar233._0_4_ = fVar159 * auVar15._0_4_;
  fVar158 = auVar113._4_4_;
  auVar233._4_4_ = fVar158 * auVar15._4_4_;
  fVar134 = auVar113._8_4_;
  auVar233._8_4_ = fVar134 * auVar15._8_4_;
  fVar135 = auVar113._12_4_;
  auVar233._12_4_ = fVar135 * auVar15._12_4_;
  auVar227._0_4_ = auVar18._0_4_ * fVar159;
  auVar227._4_4_ = auVar18._4_4_ * fVar158;
  auVar227._8_4_ = auVar18._8_4_ * fVar134;
  auVar227._12_4_ = auVar18._12_4_ * fVar135;
  auVar216._0_4_ = auVar160._0_4_ * fVar159;
  auVar216._4_4_ = auVar160._4_4_ * fVar158;
  auVar216._8_4_ = auVar160._8_4_ * fVar134;
  auVar216._12_4_ = auVar160._12_4_ * fVar135;
  auVar113 = vfmadd231ps_fma(auVar233,auVar117,auVar14);
  auVar141 = vfmadd231ps_fma(auVar227,auVar117,auVar17);
  auVar117 = vfmadd231ps_fma(auVar216,auVar114,auVar117);
  auVar177 = vfmadd231ps_fma(auVar113,auVar243,auVar13);
  auVar141 = vfmadd231ps_fma(auVar141,auVar243,auVar16);
  auVar231 = ZEXT1664(auVar141);
  auVar187 = vfmadd231ps_fma(auVar117,auVar115,auVar243);
  auVar244._4_4_ = auVar112._0_4_;
  auVar244._0_4_ = auVar112._0_4_;
  auVar244._8_4_ = auVar112._0_4_;
  auVar244._12_4_ = auVar112._0_4_;
  auVar117 = vshufps_avx(auVar112,auVar112,0x55);
  auVar113 = vshufps_avx(auVar112,auVar112,0xaa);
  fVar159 = auVar113._0_4_;
  auVar195._0_4_ = fVar159 * auVar15._0_4_;
  fVar158 = auVar113._4_4_;
  auVar195._4_4_ = fVar158 * auVar15._4_4_;
  fVar134 = auVar113._8_4_;
  auVar195._8_4_ = fVar134 * auVar15._8_4_;
  fVar135 = auVar113._12_4_;
  auVar195._12_4_ = fVar135 * auVar15._12_4_;
  auVar140._0_4_ = auVar18._0_4_ * fVar159;
  auVar140._4_4_ = auVar18._4_4_ * fVar158;
  auVar140._8_4_ = auVar18._8_4_ * fVar134;
  auVar140._12_4_ = auVar18._12_4_ * fVar135;
  auVar113._0_4_ = auVar160._0_4_ * fVar159;
  auVar113._4_4_ = auVar160._4_4_ * fVar158;
  auVar113._8_4_ = auVar160._8_4_ * fVar134;
  auVar113._12_4_ = auVar160._12_4_ * fVar135;
  auVar14 = vfmadd231ps_fma(auVar195,auVar117,auVar14);
  auVar15 = vfmadd231ps_fma(auVar140,auVar117,auVar17);
  auVar17 = vfmadd231ps_fma(auVar113,auVar117,auVar114);
  auVar18 = vfmadd231ps_fma(auVar14,auVar244,auVar13);
  auVar114 = vfmadd231ps_fma(auVar15,auVar244,auVar16);
  auVar160 = vfmadd231ps_fma(auVar17,auVar244,auVar115);
  local_310._8_4_ = 0x7fffffff;
  local_310._0_8_ = 0x7fffffff7fffffff;
  local_310._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx(auVar177,local_310);
  auVar186._8_4_ = 0x219392ef;
  auVar186._0_8_ = 0x219392ef219392ef;
  auVar186._12_4_ = 0x219392ef;
  auVar13 = vcmpps_avx(auVar13,auVar186,1);
  auVar14 = vblendvps_avx(auVar177,auVar186,auVar13);
  auVar13 = vandps_avx(auVar141,local_310);
  auVar13 = vcmpps_avx(auVar13,auVar186,1);
  auVar15 = vblendvps_avx(auVar141,auVar186,auVar13);
  auVar13 = vandps_avx(auVar187,local_310);
  auVar13 = vcmpps_avx(auVar13,auVar186,1);
  auVar13 = vblendvps_avx(auVar187,auVar186,auVar13);
  auVar16 = vrcpps_avx(auVar14);
  auVar211._8_4_ = 0x3f800000;
  auVar211._0_8_ = &DAT_3f8000003f800000;
  auVar211._12_4_ = 0x3f800000;
  auVar14 = vfnmadd213ps_fma(auVar14,auVar16,auVar211);
  auVar16 = vfmadd132ps_fma(auVar14,auVar16,auVar16);
  auVar14 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar14,auVar211);
  auVar17 = vfmadd132ps_fma(auVar15,auVar14,auVar14);
  auVar14 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar14,auVar211);
  auVar115 = vfmadd132ps_fma(auVar13,auVar14,auVar14);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar108 * 7 + 6);
  auVar13 = vpmovsxwd_avx(auVar13);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar18);
  auVar187._0_4_ = auVar16._0_4_ * auVar13._0_4_;
  auVar187._4_4_ = auVar16._4_4_ * auVar13._4_4_;
  auVar187._8_4_ = auVar16._8_4_ * auVar13._8_4_;
  auVar187._12_4_ = auVar16._12_4_ * auVar13._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar108 * 9 + 6);
  auVar13 = vpmovsxwd_avx(auVar14);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar18);
  auVar196._0_4_ = auVar16._0_4_ * auVar13._0_4_;
  auVar196._4_4_ = auVar16._4_4_ * auVar13._4_4_;
  auVar196._8_4_ = auVar16._8_4_ * auVar13._8_4_;
  auVar196._12_4_ = auVar16._12_4_ * auVar13._12_4_;
  auVar141._1_3_ = 0;
  auVar141[0] = PVar9;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar14 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar108 * -2 + 6);
  auVar13 = vpmovsxwd_avx(auVar16);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar114);
  auVar217._0_4_ = auVar13._0_4_ * auVar17._0_4_;
  auVar217._4_4_ = auVar13._4_4_ * auVar17._4_4_;
  auVar217._8_4_ = auVar13._8_4_ * auVar17._8_4_;
  auVar217._12_4_ = auVar13._12_4_ * auVar17._12_4_;
  auVar13 = vcvtdq2ps_avx(auVar14);
  auVar13 = vsubps_avx(auVar13,auVar114);
  auVar117._0_4_ = auVar17._0_4_ * auVar13._0_4_;
  auVar117._4_4_ = auVar17._4_4_ * auVar13._4_4_;
  auVar117._8_4_ = auVar17._8_4_ * auVar13._8_4_;
  auVar117._12_4_ = auVar17._12_4_ * auVar13._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar105 + uVar108 + 6);
  auVar13 = vpmovsxwd_avx(auVar17);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar160);
  auVar177._0_4_ = auVar115._0_4_ * auVar13._0_4_;
  auVar177._4_4_ = auVar115._4_4_ * auVar13._4_4_;
  auVar177._8_4_ = auVar115._8_4_ * auVar13._8_4_;
  auVar177._12_4_ = auVar115._12_4_ * auVar13._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar108 * 0x17 + 6);
  auVar13 = vpmovsxwd_avx(auVar18);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar160);
  auVar114._0_4_ = auVar115._0_4_ * auVar13._0_4_;
  auVar114._4_4_ = auVar115._4_4_ * auVar13._4_4_;
  auVar114._8_4_ = auVar115._8_4_ * auVar13._8_4_;
  auVar114._12_4_ = auVar115._12_4_ * auVar13._12_4_;
  auVar13 = vpminsd_avx(auVar187,auVar196);
  auVar14 = vpminsd_avx(auVar217,auVar117);
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar14 = vpminsd_avx(auVar177,auVar114);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar221._4_4_ = uVar110;
  auVar221._0_4_ = uVar110;
  auVar221._8_4_ = uVar110;
  auVar221._12_4_ = uVar110;
  auVar226 = ZEXT1664(auVar221);
  auVar14 = vmaxps_avx(auVar14,auVar221);
  auVar13 = vmaxps_avx(auVar13,auVar14);
  local_320._0_4_ = auVar13._0_4_ * 0.99999964;
  local_320._4_4_ = auVar13._4_4_ * 0.99999964;
  local_320._8_4_ = auVar13._8_4_ * 0.99999964;
  local_320._12_4_ = auVar13._12_4_ * 0.99999964;
  auVar13 = vpmaxsd_avx(auVar187,auVar196);
  auVar14 = vpmaxsd_avx(auVar217,auVar117);
  auVar13 = vminps_avx(auVar13,auVar14);
  auVar14 = vpmaxsd_avx(auVar177,auVar114);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar160._4_4_ = uVar110;
  auVar160._0_4_ = uVar110;
  auVar160._8_4_ = uVar110;
  auVar160._12_4_ = uVar110;
  auVar14 = vminps_avx(auVar14,auVar160);
  auVar13 = vminps_avx(auVar13,auVar14);
  auVar115._0_4_ = auVar13._0_4_ * 1.0000004;
  auVar115._4_4_ = auVar13._4_4_ * 1.0000004;
  auVar115._8_4_ = auVar13._8_4_ * 1.0000004;
  auVar115._12_4_ = auVar13._12_4_ * 1.0000004;
  auVar141[4] = PVar9;
  auVar141._5_3_ = 0;
  auVar141[8] = PVar9;
  auVar141._9_3_ = 0;
  auVar141[0xc] = PVar9;
  auVar141._13_3_ = 0;
  auVar14 = vpcmpgtd_avx(auVar141,_DAT_01ff0cf0);
  auVar13 = vcmpps_avx(local_320,auVar115,2);
  auVar13 = vandps_avx(auVar13,auVar14);
  uVar102 = vmovmskps_avx(auVar13);
  if (uVar102 != 0) {
    uVar102 = uVar102 & 0xff;
    local_5e8 = pre->ray_space + k;
    local_5e0 = mm_lookupmask_ps._16_8_;
    uStack_5d8 = mm_lookupmask_ps._24_8_;
    uStack_5d0 = mm_lookupmask_ps._16_8_;
    uStack_5c8 = mm_lookupmask_ps._24_8_;
    local_708 = (undefined1 (*) [32])&local_1e0;
    iVar103 = 1 << ((uint)k & 0x1f);
    auVar120._4_4_ = iVar103;
    auVar120._0_4_ = iVar103;
    auVar120._8_4_ = iVar103;
    auVar120._12_4_ = iVar103;
    auVar120._16_4_ = iVar103;
    auVar120._20_4_ = iVar103;
    auVar120._24_4_ = iVar103;
    auVar120._28_4_ = iVar103;
    auVar132 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar120 = vpand_avx2(auVar120,auVar132);
    local_300 = vpcmpeqd_avx2(auVar120,auVar132);
    do {
      auVar120 = local_500;
      auVar132 = auVar226._0_32_;
      auVar129 = auVar231._0_32_;
      lVar23 = 0;
      uVar108 = (ulong)uVar102;
      for (uVar105 = uVar108; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar102 = *(uint *)(prim + 2);
      uVar10 = *(uint *)(prim + lVar23 * 4 + 6);
      pGVar11 = (context->scene->geometries).items[uVar102].ptr;
      uVar105 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                                pGVar11[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar10);
      p_Var12 = pGVar11[1].intersectionFilterN;
      lVar23 = *(long *)&pGVar11[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar23 + (long)p_Var12 * uVar105);
      uVar84 = *(undefined8 *)*pauVar1;
      uVar85 = *(undefined8 *)(*pauVar1 + 8);
      auVar114 = *pauVar1;
      auVar16 = *pauVar1;
      auVar13 = *pauVar1;
      pauVar2 = (undefined1 (*) [16])(lVar23 + (uVar105 + 1) * (long)p_Var12);
      uVar86 = *(undefined8 *)*pauVar2;
      uVar87 = *(undefined8 *)(*pauVar2 + 8);
      auVar17 = *pauVar2;
      auVar15 = *pauVar2;
      pauVar3 = (undefined1 (*) [16])(lVar23 + (uVar105 + 2) * (long)p_Var12);
      uVar88 = *(undefined8 *)*pauVar3;
      uVar89 = *(undefined8 *)(*pauVar3 + 8);
      auVar18 = *pauVar3;
      auVar14 = *pauVar3;
      uVar108 = uVar108 - 1 & uVar108;
      pauVar4 = (undefined1 (*) [16])(lVar23 + (uVar105 + 3) * (long)p_Var12);
      uVar90 = *(undefined8 *)*pauVar4;
      uVar91 = *(undefined8 *)(*pauVar4 + 8);
      auVar115 = *pauVar4;
      local_7e0 = (float)uVar90;
      fStack_7dc = (float)((ulong)uVar90 >> 0x20);
      fStack_7d8 = (float)uVar91;
      fStack_7d4 = (float)((ulong)uVar91 >> 0x20);
      if (uVar108 != 0) {
        uVar107 = uVar108 - 1 & uVar108;
        for (uVar105 = uVar108; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x8000000000000000) {
        }
        if (uVar107 != 0) {
          for (; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar103 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar160 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar141 = vinsertps_avx(auVar160,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar117 = vsubps_avx(*pauVar1,auVar141);
      uVar110 = auVar117._0_4_;
      auVar188._4_4_ = uVar110;
      auVar188._0_4_ = uVar110;
      auVar188._8_4_ = uVar110;
      auVar188._12_4_ = uVar110;
      auVar160 = vshufps_avx(auVar117,auVar117,0x55);
      auVar117 = vshufps_avx(auVar117,auVar117,0xaa);
      aVar7 = (local_5e8->vx).field_0;
      aVar8 = (local_5e8->vy).field_0;
      fVar159 = (local_5e8->vz).field_0.m128[0];
      fVar158 = *(float *)((long)&(local_5e8->vz).field_0 + 4);
      fVar134 = *(float *)((long)&(local_5e8->vz).field_0 + 8);
      fVar135 = *(float *)((long)&(local_5e8->vz).field_0 + 0xc);
      auVar204._0_4_ = fVar159 * auVar117._0_4_;
      auVar204._4_4_ = fVar158 * auVar117._4_4_;
      auVar204._8_4_ = fVar134 * auVar117._8_4_;
      auVar204._12_4_ = fVar135 * auVar117._12_4_;
      auVar160 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar8,auVar160);
      auVar187 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar7,auVar188);
      auVar160 = vblendps_avx(auVar187,*pauVar1,8);
      auVar113 = vsubps_avx(*pauVar2,auVar141);
      uVar110 = auVar113._0_4_;
      auVar205._4_4_ = uVar110;
      auVar205._0_4_ = uVar110;
      auVar205._8_4_ = uVar110;
      auVar205._12_4_ = uVar110;
      auVar117 = vshufps_avx(auVar113,auVar113,0x55);
      auVar113 = vshufps_avx(auVar113,auVar113,0xaa);
      auVar228._0_4_ = fVar159 * auVar113._0_4_;
      auVar228._4_4_ = fVar158 * auVar113._4_4_;
      auVar228._8_4_ = fVar134 * auVar113._8_4_;
      auVar228._12_4_ = fVar135 * auVar113._12_4_;
      auVar117 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar8,auVar117);
      auVar112 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar7,auVar205);
      auVar117 = vblendps_avx(auVar112,*pauVar2,8);
      auVar177 = vsubps_avx(*pauVar3,auVar141);
      uVar110 = auVar177._0_4_;
      auVar212._4_4_ = uVar110;
      auVar212._0_4_ = uVar110;
      auVar212._8_4_ = uVar110;
      auVar212._12_4_ = uVar110;
      auVar113 = vshufps_avx(auVar177,auVar177,0x55);
      auVar177 = vshufps_avx(auVar177,auVar177,0xaa);
      auVar234._0_4_ = fVar159 * auVar177._0_4_;
      auVar234._4_4_ = fVar158 * auVar177._4_4_;
      auVar234._8_4_ = fVar134 * auVar177._8_4_;
      auVar234._12_4_ = fVar135 * auVar177._12_4_;
      auVar113 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar8,auVar113);
      auVar140 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar7,auVar212);
      auVar113 = vblendps_avx(auVar140,*pauVar3,8);
      auVar92._12_4_ = fStack_7d4;
      auVar92._0_12_ = *(undefined1 (*) [12])*pauVar4;
      auVar177 = vsubps_avx(auVar92,auVar141);
      uVar110 = auVar177._0_4_;
      auVar213._4_4_ = uVar110;
      auVar213._0_4_ = uVar110;
      auVar213._8_4_ = uVar110;
      auVar213._12_4_ = uVar110;
      auVar141 = vshufps_avx(auVar177,auVar177,0x55);
      auVar177 = vshufps_avx(auVar177,auVar177,0xaa);
      auVar236._0_4_ = fVar159 * auVar177._0_4_;
      auVar236._4_4_ = fVar158 * auVar177._4_4_;
      auVar236._8_4_ = fVar134 * auVar177._8_4_;
      auVar236._12_4_ = fVar135 * auVar177._12_4_;
      auVar141 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar8,auVar141);
      auVar186 = vfmadd231ps_fma(auVar141,(undefined1  [16])aVar7,auVar213);
      auVar141 = vblendps_avx(auVar186,auVar92,8);
      auVar160 = vandps_avx(auVar160,local_310);
      auVar117 = vandps_avx(auVar117,local_310);
      auVar177 = vmaxps_avx(auVar160,auVar117);
      auVar160 = vandps_avx(auVar113,local_310);
      auVar117 = vandps_avx(auVar141,local_310);
      auVar160 = vmaxps_avx(auVar160,auVar117);
      auVar160 = vmaxps_avx(auVar177,auVar160);
      auVar117 = vmovshdup_avx(auVar160);
      auVar117 = vmaxss_avx(auVar117,auVar160);
      auVar160 = vshufpd_avx(auVar160,auVar160,1);
      auVar160 = vmaxss_avx(auVar160,auVar117);
      lVar23 = (long)iVar103 * 0x44;
      auVar117 = vmovshdup_avx(auVar187);
      uVar111 = auVar117._0_8_;
      local_660._8_8_ = uVar111;
      local_660._0_8_ = uVar111;
      local_660._16_8_ = uVar111;
      local_660._24_8_ = uVar111;
      auVar149 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x484);
      auVar117 = vmovshdup_avx(auVar112);
      uVar111 = auVar117._0_8_;
      local_6e0._8_8_ = uVar111;
      local_6e0._0_8_ = uVar111;
      local_6e0._16_8_ = uVar111;
      local_6e0._24_8_ = uVar111;
      auVar203 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x908);
      uVar232 = auVar140._0_4_;
      auVar169._4_4_ = uVar232;
      auVar169._0_4_ = uVar232;
      auVar169._8_4_ = uVar232;
      auVar169._12_4_ = uVar232;
      auVar169._16_4_ = uVar232;
      auVar169._20_4_ = uVar232;
      auVar169._24_4_ = uVar232;
      auVar169._28_4_ = uVar232;
      auVar117 = vmovshdup_avx(auVar140);
      uVar111 = auVar117._0_8_;
      auVar197._8_8_ = uVar111;
      auVar197._0_8_ = uVar111;
      auVar197._16_8_ = uVar111;
      auVar197._24_8_ = uVar111;
      fVar158 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar23 + 0xd8c);
      fVar134 = *(float *)(catmullrom_basis0 + lVar23 + 0xd90);
      fVar135 = *(float *)(catmullrom_basis0 + lVar23 + 0xd94);
      fVar136 = *(float *)(catmullrom_basis0 + lVar23 + 0xd98);
      fVar137 = *(float *)(catmullrom_basis0 + lVar23 + 0xd9c);
      fVar138 = *(float *)(catmullrom_basis0 + lVar23 + 0xda0);
      fVar139 = *(float *)(catmullrom_basis0 + lVar23 + 0xda4);
      auVar100 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar23 + 0xd8c);
      local_760 = auVar186._0_4_;
      auVar117 = vmovshdup_avx(auVar186);
      auVar206._0_4_ = fVar158 * local_760;
      auVar206._4_4_ = fVar134 * local_760;
      auVar206._8_4_ = fVar135 * local_760;
      auVar206._12_4_ = fVar136 * local_760;
      auVar206._16_4_ = fVar137 * local_760;
      auVar206._20_4_ = fVar138 * local_760;
      auVar206._24_4_ = fVar139 * local_760;
      auVar206._28_4_ = 0;
      fVar242 = auVar117._0_4_;
      auVar121._0_4_ = fVar242 * fVar158;
      fVar247 = auVar117._4_4_;
      auVar121._4_4_ = fVar247 * fVar134;
      auVar121._8_4_ = fVar242 * fVar135;
      auVar121._12_4_ = fVar247 * fVar136;
      auVar121._16_4_ = fVar242 * fVar137;
      auVar121._20_4_ = fVar247 * fVar138;
      auVar121._24_4_ = fVar242 * fVar139;
      auVar121._28_4_ = 0;
      auVar117 = vfmadd231ps_fma(auVar206,auVar203,auVar169);
      auVar113 = vfmadd231ps_fma(auVar121,auVar203,auVar197);
      uVar110 = auVar112._0_4_;
      local_780._4_4_ = uVar110;
      local_780._0_4_ = uVar110;
      local_780._8_4_ = uVar110;
      local_780._12_4_ = uVar110;
      local_780._16_4_ = uVar110;
      local_780._20_4_ = uVar110;
      local_780._24_4_ = uVar110;
      local_780._28_4_ = uVar110;
      auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar149,local_780);
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar149,local_6e0);
      auVar121 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23);
      uVar110 = auVar187._0_4_;
      local_740._4_4_ = uVar110;
      local_740._0_4_ = uVar110;
      local_740._8_4_ = uVar110;
      local_740._12_4_ = uVar110;
      local_740._16_4_ = uVar110;
      local_740._20_4_ = uVar110;
      local_740._24_4_ = uVar110;
      local_740._28_4_ = uVar110;
      auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar121,local_740);
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar121,local_660);
      auVar206 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x908);
      fVar77 = *(float *)(catmullrom_basis1 + lVar23 + 0xd8c);
      fVar78 = *(float *)(catmullrom_basis1 + lVar23 + 0xd90);
      fVar79 = *(float *)(catmullrom_basis1 + lVar23 + 0xd94);
      fVar80 = *(float *)(catmullrom_basis1 + lVar23 + 0xd98);
      fVar81 = *(float *)(catmullrom_basis1 + lVar23 + 0xd9c);
      fVar82 = *(float *)(catmullrom_basis1 + lVar23 + 0xda0);
      fVar83 = *(float *)(catmullrom_basis1 + lVar23 + 0xda4);
      auVar225._4_4_ = fVar78 * local_760;
      auVar225._0_4_ = fVar77 * local_760;
      auVar225._8_4_ = fVar79 * local_760;
      auVar225._12_4_ = fVar80 * local_760;
      auVar225._16_4_ = fVar81 * local_760;
      auVar225._20_4_ = fVar82 * local_760;
      auVar225._24_4_ = fVar83 * local_760;
      auVar225._28_4_ = local_760;
      auVar141 = vfmadd231ps_fma(auVar225,auVar206,auVar169);
      auVar199._4_4_ = fVar247 * fVar78;
      auVar199._0_4_ = fVar242 * fVar77;
      auVar199._8_4_ = fVar242 * fVar79;
      auVar199._12_4_ = fVar247 * fVar80;
      auVar199._16_4_ = fVar242 * fVar81;
      auVar199._20_4_ = fVar247 * fVar82;
      auVar199._24_4_ = fVar242 * fVar83;
      auVar199._28_4_ = uVar232;
      auVar177 = vfmadd231ps_fma(auVar199,auVar206,auVar197);
      auVar225 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x484);
      auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar225,local_780);
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar225,local_6e0);
      auVar199 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23);
      auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar199,local_740);
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar199,local_660);
      auVar144 = ZEXT1632(auVar141);
      local_340 = ZEXT1632(auVar117);
      auVar19 = vsubps_avx(auVar144,local_340);
      auVar170 = ZEXT1632(auVar177);
      auVar122 = ZEXT1632(auVar113);
      auVar151 = vsubps_avx(auVar170,auVar122);
      auVar123._0_4_ = auVar113._0_4_ * auVar19._0_4_;
      auVar123._4_4_ = auVar113._4_4_ * auVar19._4_4_;
      auVar123._8_4_ = auVar113._8_4_ * auVar19._8_4_;
      auVar123._12_4_ = auVar113._12_4_ * auVar19._12_4_;
      auVar123._16_4_ = auVar19._16_4_ * 0.0;
      auVar123._20_4_ = auVar19._20_4_ * 0.0;
      auVar123._24_4_ = auVar19._24_4_ * 0.0;
      auVar123._28_4_ = 0;
      fVar235 = auVar151._0_4_;
      auVar145._0_4_ = fVar235 * auVar117._0_4_;
      fVar241 = auVar151._4_4_;
      auVar145._4_4_ = fVar241 * auVar117._4_4_;
      fVar248 = auVar151._8_4_;
      auVar145._8_4_ = fVar248 * auVar117._8_4_;
      fVar249 = auVar151._12_4_;
      auVar145._12_4_ = fVar249 * auVar117._12_4_;
      fVar250 = auVar151._16_4_;
      auVar145._16_4_ = fVar250 * 0.0;
      fVar251 = auVar151._20_4_;
      auVar145._20_4_ = fVar251 * 0.0;
      fVar252 = auVar151._24_4_;
      auVar145._24_4_ = fVar252 * 0.0;
      auVar145._28_4_ = 0;
      auVar123 = vsubps_avx(auVar123,auVar145);
      auVar117 = vpermilps_avx(*pauVar1,0xff);
      uVar111 = auVar117._0_8_;
      local_80._8_8_ = uVar111;
      local_80._0_8_ = uVar111;
      local_80._16_8_ = uVar111;
      local_80._24_8_ = uVar111;
      auVar113 = vpermilps_avx(*pauVar2,0xff);
      uVar111 = auVar113._0_8_;
      local_a0._8_8_ = uVar111;
      local_a0._0_8_ = uVar111;
      local_a0._16_8_ = uVar111;
      local_a0._24_8_ = uVar111;
      auVar113 = vpermilps_avx(*pauVar3,0xff);
      uVar111 = auVar113._0_8_;
      local_c0._8_8_ = uVar111;
      local_c0._0_8_ = uVar111;
      local_c0._16_8_ = uVar111;
      local_c0._24_8_ = uVar111;
      auVar93._12_4_ = fStack_7d4;
      auVar93._0_12_ = *(undefined1 (*) [12])*pauVar4;
      auVar113 = vpermilps_avx(auVar93,0xff);
      local_e0 = auVar113._0_8_;
      fVar159 = auVar113._0_4_;
      auVar207._0_4_ = fVar158 * fVar159;
      fVar158 = auVar113._4_4_;
      auVar207._4_4_ = fVar134 * fVar158;
      auVar207._8_4_ = fVar135 * fVar159;
      auVar207._12_4_ = fVar136 * fVar158;
      auVar207._16_4_ = fVar137 * fVar159;
      auVar207._20_4_ = fVar138 * fVar158;
      auVar207._24_4_ = fVar139 * fVar159;
      auVar207._28_4_ = 0;
      auVar113 = vfmadd231ps_fma(auVar207,local_c0,auVar203);
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),local_a0,auVar149);
      auVar141 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar121,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar130._4_4_ = fVar78 * fVar158;
      auVar130._0_4_ = fVar77 * fVar159;
      auVar130._8_4_ = fVar79 * fVar159;
      auVar130._12_4_ = fVar80 * fVar158;
      auVar130._16_4_ = fVar81 * fVar159;
      auVar130._20_4_ = fVar82 * fVar158;
      auVar130._24_4_ = fVar83 * fVar159;
      auVar130._28_4_ = auVar121._28_4_;
      auVar113 = vfmadd231ps_fma(auVar130,auVar206,local_c0);
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar225,local_a0);
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar199,local_80);
      auVar20._4_4_ = fVar241 * fVar241;
      auVar20._0_4_ = fVar235 * fVar235;
      auVar20._8_4_ = fVar248 * fVar248;
      auVar20._12_4_ = fVar249 * fVar249;
      auVar20._16_4_ = fVar250 * fVar250;
      auVar20._20_4_ = fVar251 * fVar251;
      auVar20._24_4_ = fVar252 * fVar252;
      auVar20._28_4_ = auVar117._4_4_;
      auVar117 = vfmadd231ps_fma(auVar20,auVar19,auVar19);
      auVar130 = vmaxps_avx(ZEXT1632(auVar141),ZEXT1632(auVar177));
      auVar21._4_4_ = auVar130._4_4_ * auVar130._4_4_ * auVar117._4_4_;
      auVar21._0_4_ = auVar130._0_4_ * auVar130._0_4_ * auVar117._0_4_;
      auVar21._8_4_ = auVar130._8_4_ * auVar130._8_4_ * auVar117._8_4_;
      auVar21._12_4_ = auVar130._12_4_ * auVar130._12_4_ * auVar117._12_4_;
      auVar21._16_4_ = auVar130._16_4_ * auVar130._16_4_ * 0.0;
      auVar21._20_4_ = auVar130._20_4_ * auVar130._20_4_ * 0.0;
      auVar21._24_4_ = auVar130._24_4_ * auVar130._24_4_ * 0.0;
      auVar21._28_4_ = auVar130._28_4_;
      auVar22._4_4_ = auVar123._4_4_ * auVar123._4_4_;
      auVar22._0_4_ = auVar123._0_4_ * auVar123._0_4_;
      auVar22._8_4_ = auVar123._8_4_ * auVar123._8_4_;
      auVar22._12_4_ = auVar123._12_4_ * auVar123._12_4_;
      auVar22._16_4_ = auVar123._16_4_ * auVar123._16_4_;
      auVar22._20_4_ = auVar123._20_4_ * auVar123._20_4_;
      auVar22._24_4_ = auVar123._24_4_ * auVar123._24_4_;
      auVar22._28_4_ = auVar123._28_4_;
      auVar130 = vcmpps_avx(auVar22,auVar21,2);
      auVar176 = ZEXT3264(auVar130);
      fVar159 = auVar160._0_4_ * 4.7683716e-07;
      auVar124._0_4_ = (float)iVar103;
      local_500._4_12_ = auVar140._4_12_;
      local_500._0_4_ = auVar124._0_4_;
      local_500._16_16_ = auVar120._16_16_;
      auVar124._4_4_ = auVar124._0_4_;
      auVar124._8_4_ = auVar124._0_4_;
      auVar124._12_4_ = auVar124._0_4_;
      auVar124._16_4_ = auVar124._0_4_;
      auVar124._20_4_ = auVar124._0_4_;
      auVar124._24_4_ = auVar124._0_4_;
      auVar124._28_4_ = auVar124._0_4_;
      auVar120 = vcmpps_avx(_DAT_02020f40,auVar124,1);
      auVar117 = vpermilps_avx(auVar187,0xaa);
      uVar111 = auVar117._0_8_;
      local_560._8_8_ = uVar111;
      local_560._0_8_ = uVar111;
      local_560._16_8_ = uVar111;
      local_560._24_8_ = uVar111;
      auVar113 = vpermilps_avx(auVar112,0xaa);
      uVar111 = auVar113._0_8_;
      local_540._8_8_ = uVar111;
      local_540._0_8_ = uVar111;
      local_540._16_8_ = uVar111;
      local_540._24_8_ = uVar111;
      auVar160 = vshufps_avx(auVar140,auVar140,0xaa);
      uVar111 = auVar160._0_8_;
      local_2e0._8_8_ = uVar111;
      local_2e0._0_8_ = uVar111;
      local_2e0._16_8_ = uVar111;
      local_2e0._24_8_ = uVar111;
      auVar160 = vshufps_avx(auVar186,auVar186,0xaa);
      uVar111 = auVar160._0_8_;
      register0x00001508 = uVar111;
      local_6c0 = uVar111;
      register0x00001510 = uVar111;
      register0x00001518 = uVar111;
      auVar239 = ZEXT3264(_local_6c0);
      auVar123 = auVar120 & auVar130;
      uVar106 = *(uint *)(ray + k * 4 + 0x60);
      local_700._0_16_ = ZEXT416(uVar106);
      fStack_75c = local_760;
      fStack_758 = local_760;
      fStack_754 = local_760;
      fStack_750 = local_760;
      fStack_74c = local_760;
      fStack_748 = local_760;
      fStack_744 = local_760;
      if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar123 >> 0x7f,0) == '\0') &&
            (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar123 >> 0xbf,0) == '\0') &&
          (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar123[0x1f]) {
        auVar231 = ZEXT3264(auVar129);
        auVar226 = ZEXT3264(auVar132);
        auVar157 = ZEXT3264(local_6e0);
        auVar214 = ZEXT3264(CONCAT428(local_760,
                                      CONCAT424(local_760,
                                                CONCAT420(local_760,
                                                          CONCAT416(local_760,
                                                                    CONCAT412(local_760,
                                                                              CONCAT48(local_760,
                                                                                       CONCAT44(
                                                  local_760,local_760))))))));
        auVar220 = ZEXT3264(local_780);
        auVar210 = ZEXT3264(local_740);
      }
      else {
        local_360 = vandps_avx(auVar130,auVar120);
        fVar235 = auVar160._0_4_;
        fVar241 = auVar160._4_4_;
        auVar24._4_4_ = fVar241 * fVar78;
        auVar24._0_4_ = fVar235 * fVar77;
        auVar24._8_4_ = fVar235 * fVar79;
        auVar24._12_4_ = fVar241 * fVar80;
        auVar24._16_4_ = fVar235 * fVar81;
        auVar24._20_4_ = fVar241 * fVar82;
        auVar24._24_4_ = fVar235 * fVar83;
        auVar24._28_4_ = local_360._28_4_;
        auVar160 = vfmadd213ps_fma(auVar206,local_2e0,auVar24);
        auVar160 = vfmadd213ps_fma(auVar225,local_540,ZEXT1632(auVar160));
        auVar160 = vfmadd213ps_fma(auVar199,local_560,ZEXT1632(auVar160));
        local_5c0._0_4_ = auVar100._0_4_;
        local_5c0._4_4_ = auVar100._4_4_;
        fStack_5b8 = auVar100._8_4_;
        fStack_5b4 = auVar100._12_4_;
        fStack_5b0 = auVar100._16_4_;
        fStack_5ac = auVar100._20_4_;
        fStack_5a8 = auVar100._24_4_;
        auVar125._0_4_ = fVar235 * (float)local_5c0._0_4_;
        auVar125._4_4_ = fVar241 * (float)local_5c0._4_4_;
        auVar125._8_4_ = fVar235 * fStack_5b8;
        auVar125._12_4_ = fVar241 * fStack_5b4;
        auVar125._16_4_ = fVar235 * fStack_5b0;
        auVar125._20_4_ = fVar241 * fStack_5ac;
        auVar125._24_4_ = fVar235 * fStack_5a8;
        auVar125._28_4_ = 0;
        auVar187 = vfmadd213ps_fma(auVar203,local_2e0,auVar125);
        auVar187 = vfmadd213ps_fma(auVar149,local_540,ZEXT1632(auVar187));
        auVar120 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1210);
        auVar149 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1694);
        auVar203 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1b18);
        fVar158 = *(float *)(catmullrom_basis0 + lVar23 + 0x1f9c);
        fVar134 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa0);
        fVar135 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa4);
        fVar136 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa8);
        fVar137 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fac);
        fVar138 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fb0);
        fVar139 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fb4);
        auVar198._0_4_ = local_760 * fVar158;
        auVar198._4_4_ = local_760 * fVar134;
        auVar198._8_4_ = local_760 * fVar135;
        auVar198._12_4_ = local_760 * fVar136;
        auVar198._16_4_ = local_760 * fVar137;
        auVar198._20_4_ = local_760 * fVar138;
        auVar198._24_4_ = local_760 * fVar139;
        auVar198._28_4_ = 0;
        auVar25._4_4_ = fVar247 * fVar134;
        auVar25._0_4_ = fVar242 * fVar158;
        auVar25._8_4_ = fVar242 * fVar135;
        auVar25._12_4_ = fVar247 * fVar136;
        auVar25._16_4_ = fVar242 * fVar137;
        auVar25._20_4_ = fVar247 * fVar138;
        auVar25._24_4_ = fVar242 * fVar139;
        auVar25._28_4_ = auVar113._4_4_;
        auVar26._4_4_ = fVar241 * fVar134;
        auVar26._0_4_ = fVar235 * fVar158;
        auVar26._8_4_ = fVar235 * fVar135;
        auVar26._12_4_ = fVar241 * fVar136;
        auVar26._16_4_ = fVar235 * fVar137;
        auVar26._20_4_ = fVar241 * fVar138;
        auVar26._24_4_ = fVar235 * fVar139;
        auVar26._28_4_ = fVar241;
        auVar113 = vfmadd231ps_fma(auVar198,auVar203,auVar169);
        auVar112 = vfmadd231ps_fma(auVar25,auVar203,auVar197);
        auVar140 = vfmadd231ps_fma(auVar26,local_2e0,auVar203);
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar149,local_780);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar149,local_6e0);
        auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar149,local_540);
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar120,local_740);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar120,local_660);
        auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),local_560,auVar120);
        fVar158 = *(float *)(catmullrom_basis1 + lVar23 + 0x1f9c);
        fVar134 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa0);
        fVar135 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa4);
        fVar136 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa8);
        fVar137 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fac);
        fVar138 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fb0);
        fVar139 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fb4);
        auVar149._4_4_ = local_760 * fVar134;
        auVar149._0_4_ = local_760 * fVar158;
        auVar149._8_4_ = local_760 * fVar135;
        auVar149._12_4_ = local_760 * fVar136;
        auVar149._16_4_ = local_760 * fVar137;
        auVar149._20_4_ = local_760 * fVar138;
        auVar149._24_4_ = local_760 * fVar139;
        auVar149._28_4_ = auVar120._28_4_;
        auVar203._4_4_ = fVar247 * fVar134;
        auVar203._0_4_ = fVar242 * fVar158;
        auVar203._8_4_ = fVar242 * fVar135;
        auVar203._12_4_ = fVar247 * fVar136;
        auVar203._16_4_ = fVar242 * fVar137;
        auVar203._20_4_ = fVar247 * fVar138;
        auVar203._24_4_ = fVar242 * fVar139;
        auVar203._28_4_ = fVar247;
        auVar27._4_4_ = fVar134 * fVar241;
        auVar27._0_4_ = fVar158 * fVar235;
        auVar27._8_4_ = fVar135 * fVar235;
        auVar27._12_4_ = fVar136 * fVar241;
        auVar27._16_4_ = fVar137 * fVar235;
        auVar27._20_4_ = fVar138 * fVar241;
        auVar27._24_4_ = fVar139 * fVar235;
        auVar27._28_4_ = auVar117._4_4_;
        auVar120 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1b18);
        auVar117 = vfmadd231ps_fma(auVar149,auVar120,auVar169);
        auVar186 = vfmadd231ps_fma(auVar203,auVar120,auVar197);
        auVar194 = vfmadd231ps_fma(auVar27,auVar120,local_2e0);
        auVar120 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1694);
        auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar120,local_780);
        auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar120,local_6e0);
        auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),local_540,auVar120);
        auVar120 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1210);
        auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar120,local_740);
        auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar120,local_660);
        auVar146._8_4_ = 0x7fffffff;
        auVar146._0_8_ = 0x7fffffff7fffffff;
        auVar146._12_4_ = 0x7fffffff;
        auVar146._16_4_ = 0x7fffffff;
        auVar146._20_4_ = 0x7fffffff;
        auVar146._24_4_ = 0x7fffffff;
        auVar146._28_4_ = 0x7fffffff;
        auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),local_560,auVar120);
        auVar120 = vandps_avx(ZEXT1632(auVar113),auVar146);
        auVar149 = vandps_avx(ZEXT1632(auVar112),auVar146);
        auVar149 = vmaxps_avx(auVar120,auVar149);
        auVar120 = vandps_avx(ZEXT1632(auVar140),auVar146);
        auVar120 = vmaxps_avx(auVar149,auVar120);
        auVar171._4_4_ = fVar159;
        auVar171._0_4_ = fVar159;
        auVar171._8_4_ = fVar159;
        auVar171._12_4_ = fVar159;
        auVar171._16_4_ = fVar159;
        auVar171._20_4_ = fVar159;
        auVar171._24_4_ = fVar159;
        auVar171._28_4_ = fVar159;
        auVar120 = vcmpps_avx(auVar120,auVar171,1);
        auVar203 = vblendvps_avx(ZEXT1632(auVar113),auVar19,auVar120);
        auVar206 = vblendvps_avx(ZEXT1632(auVar112),auVar151,auVar120);
        auVar120 = vandps_avx(ZEXT1632(auVar117),auVar146);
        auVar149 = vandps_avx(ZEXT1632(auVar186),auVar146);
        auVar225 = vmaxps_avx(auVar120,auVar149);
        auVar120 = vandps_avx(ZEXT1632(auVar194),auVar146);
        auVar120 = vmaxps_avx(auVar225,auVar120);
        auVar199 = vcmpps_avx(auVar120,auVar171,1);
        auVar120 = vblendvps_avx(ZEXT1632(auVar117),auVar19,auVar199);
        auVar225 = vblendvps_avx(ZEXT1632(auVar186),auVar151,auVar199);
        auVar117 = vfmadd213ps_fma(auVar121,local_560,ZEXT1632(auVar187));
        auVar113 = vfmadd213ps_fma(auVar203,auVar203,ZEXT832(0) << 0x20);
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar206,auVar206);
        auVar121 = vrsqrtps_avx(ZEXT1632(auVar113));
        fVar158 = auVar121._0_4_;
        fVar134 = auVar121._4_4_;
        fVar135 = auVar121._8_4_;
        fVar136 = auVar121._12_4_;
        fVar137 = auVar121._16_4_;
        fVar138 = auVar121._20_4_;
        fVar139 = auVar121._24_4_;
        auVar19._4_4_ = fVar134 * fVar134 * fVar134 * auVar113._4_4_ * -0.5;
        auVar19._0_4_ = fVar158 * fVar158 * fVar158 * auVar113._0_4_ * -0.5;
        auVar19._8_4_ = fVar135 * fVar135 * fVar135 * auVar113._8_4_ * -0.5;
        auVar19._12_4_ = fVar136 * fVar136 * fVar136 * auVar113._12_4_ * -0.5;
        auVar19._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
        auVar19._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar19._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar19._28_4_ = auVar149._28_4_;
        auVar245._8_4_ = 0x3fc00000;
        auVar245._0_8_ = 0x3fc000003fc00000;
        auVar245._12_4_ = 0x3fc00000;
        auVar245._16_4_ = 0x3fc00000;
        auVar245._20_4_ = 0x3fc00000;
        auVar245._24_4_ = 0x3fc00000;
        auVar245._28_4_ = 0x3fc00000;
        auVar113 = vfmadd231ps_fma(auVar19,auVar245,auVar121);
        fVar158 = auVar113._0_4_;
        fVar134 = auVar113._4_4_;
        auVar28._4_4_ = fVar134 * auVar206._4_4_;
        auVar28._0_4_ = fVar158 * auVar206._0_4_;
        fVar135 = auVar113._8_4_;
        auVar28._8_4_ = fVar135 * auVar206._8_4_;
        fVar136 = auVar113._12_4_;
        auVar28._12_4_ = fVar136 * auVar206._12_4_;
        auVar28._16_4_ = auVar206._16_4_ * 0.0;
        auVar28._20_4_ = auVar206._20_4_ * 0.0;
        auVar28._24_4_ = auVar206._24_4_ * 0.0;
        auVar28._28_4_ = 0;
        auVar29._4_4_ = fVar134 * -auVar203._4_4_;
        auVar29._0_4_ = fVar158 * -auVar203._0_4_;
        auVar29._8_4_ = fVar135 * -auVar203._8_4_;
        auVar29._12_4_ = fVar136 * -auVar203._12_4_;
        auVar29._16_4_ = -auVar203._16_4_ * 0.0;
        auVar29._20_4_ = -auVar203._20_4_ * 0.0;
        auVar29._24_4_ = -auVar203._24_4_ * 0.0;
        auVar29._28_4_ = auVar121._28_4_;
        auVar113 = vfmadd213ps_fma(auVar120,auVar120,ZEXT832(0) << 0x20);
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar225,auVar225);
        auVar149 = vrsqrtps_avx(ZEXT1632(auVar113));
        auVar30._28_4_ = auVar199._28_4_;
        auVar30._0_28_ =
             ZEXT1628(CONCAT412(fVar136 * 0.0,
                                CONCAT48(fVar135 * 0.0,CONCAT44(fVar134 * 0.0,fVar158 * 0.0))));
        fVar158 = auVar149._0_4_;
        fVar134 = auVar149._4_4_;
        fVar135 = auVar149._8_4_;
        fVar136 = auVar149._12_4_;
        fVar137 = auVar149._16_4_;
        fVar138 = auVar149._20_4_;
        fVar139 = auVar149._24_4_;
        auVar31._4_4_ = fVar134 * fVar134 * fVar134 * auVar113._4_4_ * -0.5;
        auVar31._0_4_ = fVar158 * fVar158 * fVar158 * auVar113._0_4_ * -0.5;
        auVar31._8_4_ = fVar135 * fVar135 * fVar135 * auVar113._8_4_ * -0.5;
        auVar31._12_4_ = fVar136 * fVar136 * fVar136 * auVar113._12_4_ * -0.5;
        auVar31._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
        auVar31._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar31._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar31._28_4_ = 0;
        auVar113 = vfmadd231ps_fma(auVar31,auVar245,auVar149);
        fVar158 = auVar113._0_4_;
        auVar229._0_4_ = auVar225._0_4_ * fVar158;
        fVar134 = auVar113._4_4_;
        auVar229._4_4_ = auVar225._4_4_ * fVar134;
        fVar135 = auVar113._8_4_;
        auVar229._8_4_ = auVar225._8_4_ * fVar135;
        fVar136 = auVar113._12_4_;
        auVar229._12_4_ = auVar225._12_4_ * fVar136;
        auVar229._16_4_ = auVar225._16_4_ * 0.0;
        auVar229._20_4_ = auVar225._20_4_ * 0.0;
        auVar229._24_4_ = auVar225._24_4_ * 0.0;
        auVar229._28_4_ = 0;
        auVar32._4_4_ = -auVar120._4_4_ * fVar134;
        auVar32._0_4_ = -auVar120._0_4_ * fVar158;
        auVar32._8_4_ = -auVar120._8_4_ * fVar135;
        auVar32._12_4_ = -auVar120._12_4_ * fVar136;
        auVar32._16_4_ = -auVar120._16_4_ * 0.0;
        auVar32._20_4_ = -auVar120._20_4_ * 0.0;
        auVar32._24_4_ = -auVar120._24_4_ * 0.0;
        auVar32._28_4_ = auVar225._28_4_;
        auVar33._28_4_ = auVar149._28_4_;
        auVar33._0_28_ =
             ZEXT1628(CONCAT412(fVar136 * 0.0,
                                CONCAT48(fVar135 * 0.0,CONCAT44(fVar134 * 0.0,fVar158 * 0.0))));
        auVar113 = vfmadd213ps_fma(auVar28,ZEXT1632(auVar141),local_340);
        auVar120 = ZEXT1632(auVar141);
        auVar187 = vfmadd213ps_fma(auVar29,auVar120,auVar122);
        auVar112 = vfmadd213ps_fma(auVar30,auVar120,ZEXT1632(auVar117));
        auVar194 = vfnmadd213ps_fma(auVar28,auVar120,local_340);
        auVar140 = vfmadd213ps_fma(auVar229,ZEXT1632(auVar177),auVar144);
        auVar195 = vfnmadd213ps_fma(auVar29,auVar120,auVar122);
        auVar120 = ZEXT1632(auVar177);
        auVar186 = vfmadd213ps_fma(auVar32,auVar120,auVar170);
        auVar207 = ZEXT1632(auVar141);
        auVar216 = vfnmadd231ps_fma(ZEXT1632(auVar117),auVar207,auVar30);
        auVar117 = vfmadd213ps_fma(auVar33,auVar120,ZEXT1632(auVar160));
        auVar196 = vfnmadd213ps_fma(auVar229,auVar120,auVar144);
        auVar211 = vfnmadd213ps_fma(auVar32,auVar120,auVar170);
        auVar217 = vfnmadd231ps_fma(ZEXT1632(auVar160),ZEXT1632(auVar177),auVar33);
        auVar120 = vsubps_avx(ZEXT1632(auVar186),ZEXT1632(auVar195));
        auVar149 = vsubps_avx(ZEXT1632(auVar117),ZEXT1632(auVar216));
        auVar122._4_4_ = auVar216._4_4_ * auVar120._4_4_;
        auVar122._0_4_ = auVar216._0_4_ * auVar120._0_4_;
        auVar122._8_4_ = auVar216._8_4_ * auVar120._8_4_;
        auVar122._12_4_ = auVar216._12_4_ * auVar120._12_4_;
        auVar122._16_4_ = auVar120._16_4_ * 0.0;
        auVar122._20_4_ = auVar120._20_4_ * 0.0;
        auVar122._24_4_ = auVar120._24_4_ * 0.0;
        auVar122._28_4_ = 0;
        auVar141 = vfmsub231ps_fma(auVar122,ZEXT1632(auVar195),auVar149);
        auVar144._4_4_ = auVar149._4_4_ * auVar194._4_4_;
        auVar144._0_4_ = auVar149._0_4_ * auVar194._0_4_;
        auVar144._8_4_ = auVar149._8_4_ * auVar194._8_4_;
        auVar144._12_4_ = auVar149._12_4_ * auVar194._12_4_;
        auVar144._16_4_ = auVar149._16_4_ * 0.0;
        auVar144._20_4_ = auVar149._20_4_ * 0.0;
        auVar144._24_4_ = auVar149._24_4_ * 0.0;
        auVar144._28_4_ = auVar149._28_4_;
        auVar149 = vsubps_avx(ZEXT1632(auVar140),ZEXT1632(auVar194));
        auVar160 = vfmsub231ps_fma(auVar144,ZEXT1632(auVar216),auVar149);
        auVar170._4_4_ = auVar195._4_4_ * auVar149._4_4_;
        auVar170._0_4_ = auVar195._0_4_ * auVar149._0_4_;
        auVar170._8_4_ = auVar195._8_4_ * auVar149._8_4_;
        auVar170._12_4_ = auVar195._12_4_ * auVar149._12_4_;
        auVar170._16_4_ = auVar149._16_4_ * 0.0;
        auVar170._20_4_ = auVar149._20_4_ * 0.0;
        auVar170._24_4_ = auVar149._24_4_ * 0.0;
        auVar170._28_4_ = auVar149._28_4_;
        auVar199 = ZEXT1632(auVar194);
        auVar194 = vfmsub231ps_fma(auVar170,auVar199,auVar120);
        auVar160 = vfmadd231ps_fma(ZEXT1632(auVar194),ZEXT832(0) << 0x20,ZEXT1632(auVar160));
        auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),ZEXT832(0) << 0x20,ZEXT1632(auVar141));
        auVar123 = vcmpps_avx(ZEXT1632(auVar160),ZEXT832(0) << 0x20,2);
        auVar120 = vblendvps_avx(ZEXT1632(auVar196),ZEXT1632(auVar113),auVar123);
        auVar149 = vblendvps_avx(ZEXT1632(auVar211),ZEXT1632(auVar187),auVar123);
        auVar203 = vblendvps_avx(ZEXT1632(auVar217),ZEXT1632(auVar112),auVar123);
        auVar121 = vblendvps_avx(auVar199,ZEXT1632(auVar140),auVar123);
        auVar206 = vblendvps_avx(ZEXT1632(auVar195),ZEXT1632(auVar186),auVar123);
        auVar225 = vblendvps_avx(ZEXT1632(auVar216),ZEXT1632(auVar117),auVar123);
        auVar199 = vblendvps_avx(ZEXT1632(auVar140),auVar199,auVar123);
        auVar130 = vblendvps_avx(ZEXT1632(auVar186),ZEXT1632(auVar195),auVar123);
        auVar160 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        auVar19 = vblendvps_avx(ZEXT1632(auVar117),ZEXT1632(auVar216),auVar123);
        auVar20 = vsubps_avx(auVar199,auVar120);
        auVar21 = vsubps_avx(auVar130,auVar149);
        auVar22 = vsubps_avx(auVar19,auVar203);
        auVar122 = vsubps_avx(auVar120,auVar121);
        auVar144 = vsubps_avx(auVar149,auVar206);
        auVar145 = vsubps_avx(auVar203,auVar225);
        auVar34._4_4_ = auVar22._4_4_ * auVar120._4_4_;
        auVar34._0_4_ = auVar22._0_4_ * auVar120._0_4_;
        auVar34._8_4_ = auVar22._8_4_ * auVar120._8_4_;
        auVar34._12_4_ = auVar22._12_4_ * auVar120._12_4_;
        auVar34._16_4_ = auVar22._16_4_ * auVar120._16_4_;
        auVar34._20_4_ = auVar22._20_4_ * auVar120._20_4_;
        auVar34._24_4_ = auVar22._24_4_ * auVar120._24_4_;
        auVar34._28_4_ = auVar19._28_4_;
        auVar117 = vfmsub231ps_fma(auVar34,auVar203,auVar20);
        auVar35._4_4_ = auVar20._4_4_ * auVar149._4_4_;
        auVar35._0_4_ = auVar20._0_4_ * auVar149._0_4_;
        auVar35._8_4_ = auVar20._8_4_ * auVar149._8_4_;
        auVar35._12_4_ = auVar20._12_4_ * auVar149._12_4_;
        auVar35._16_4_ = auVar20._16_4_ * auVar149._16_4_;
        auVar35._20_4_ = auVar20._20_4_ * auVar149._20_4_;
        auVar35._24_4_ = auVar20._24_4_ * auVar149._24_4_;
        auVar35._28_4_ = auVar199._28_4_;
        auVar113 = vfmsub231ps_fma(auVar35,auVar120,auVar21);
        auVar117 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT832(0) << 0x20,ZEXT1632(auVar117));
        auVar126._0_4_ = auVar21._0_4_ * auVar203._0_4_;
        auVar126._4_4_ = auVar21._4_4_ * auVar203._4_4_;
        auVar126._8_4_ = auVar21._8_4_ * auVar203._8_4_;
        auVar126._12_4_ = auVar21._12_4_ * auVar203._12_4_;
        auVar126._16_4_ = auVar21._16_4_ * auVar203._16_4_;
        auVar126._20_4_ = auVar21._20_4_ * auVar203._20_4_;
        auVar126._24_4_ = auVar21._24_4_ * auVar203._24_4_;
        auVar126._28_4_ = 0;
        auVar113 = vfmsub231ps_fma(auVar126,auVar149,auVar22);
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT832(0) << 0x20,ZEXT1632(auVar113));
        auVar176 = ZEXT1664(auVar113);
        auVar127._0_4_ = auVar145._0_4_ * auVar121._0_4_;
        auVar127._4_4_ = auVar145._4_4_ * auVar121._4_4_;
        auVar127._8_4_ = auVar145._8_4_ * auVar121._8_4_;
        auVar127._12_4_ = auVar145._12_4_ * auVar121._12_4_;
        auVar127._16_4_ = auVar145._16_4_ * auVar121._16_4_;
        auVar127._20_4_ = auVar145._20_4_ * auVar121._20_4_;
        auVar127._24_4_ = auVar145._24_4_ * auVar121._24_4_;
        auVar127._28_4_ = 0;
        auVar117 = vfmsub231ps_fma(auVar127,auVar122,auVar225);
        auVar36._4_4_ = auVar144._4_4_ * auVar225._4_4_;
        auVar36._0_4_ = auVar144._0_4_ * auVar225._0_4_;
        auVar36._8_4_ = auVar144._8_4_ * auVar225._8_4_;
        auVar36._12_4_ = auVar144._12_4_ * auVar225._12_4_;
        auVar36._16_4_ = auVar144._16_4_ * auVar225._16_4_;
        auVar36._20_4_ = auVar144._20_4_ * auVar225._20_4_;
        auVar36._24_4_ = auVar144._24_4_ * auVar225._24_4_;
        auVar36._28_4_ = auVar225._28_4_;
        auVar141 = vfmsub231ps_fma(auVar36,auVar206,auVar145);
        auVar37._4_4_ = auVar122._4_4_ * auVar206._4_4_;
        auVar37._0_4_ = auVar122._0_4_ * auVar206._0_4_;
        auVar37._8_4_ = auVar122._8_4_ * auVar206._8_4_;
        auVar37._12_4_ = auVar122._12_4_ * auVar206._12_4_;
        auVar37._16_4_ = auVar122._16_4_ * auVar206._16_4_;
        auVar37._20_4_ = auVar122._20_4_ * auVar206._20_4_;
        auVar37._24_4_ = auVar122._24_4_ * auVar206._24_4_;
        auVar37._28_4_ = auVar130._28_4_;
        auVar187 = vfmsub231ps_fma(auVar37,auVar144,auVar121);
        auVar117 = vfmadd231ps_fma(ZEXT1632(auVar187),ZEXT832(0) << 0x20,ZEXT1632(auVar117));
        auVar141 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT832(0) << 0x20,ZEXT1632(auVar141));
        auVar121 = vmaxps_avx(ZEXT1632(auVar113),ZEXT1632(auVar141));
        auVar121 = vcmpps_avx(auVar121,ZEXT832(0) << 0x20,2);
        auVar117 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
        auVar160 = vpand_avx(auVar117,auVar160);
        auVar121 = vpmovsxwd_avx2(auVar160);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar121 >> 0x7f,0) == '\0') &&
              (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar121 >> 0xbf,0) == '\0') &&
            (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar121[0x1f]) {
LAB_016ce831:
          auVar210 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar231 = ZEXT3264(auVar129);
          auVar226 = ZEXT3264(auVar132);
        }
        else {
          auVar38._4_4_ = auVar21._4_4_ * auVar145._4_4_;
          auVar38._0_4_ = auVar21._0_4_ * auVar145._0_4_;
          auVar38._8_4_ = auVar21._8_4_ * auVar145._8_4_;
          auVar38._12_4_ = auVar21._12_4_ * auVar145._12_4_;
          auVar38._16_4_ = auVar21._16_4_ * auVar145._16_4_;
          auVar38._20_4_ = auVar21._20_4_ * auVar145._20_4_;
          auVar38._24_4_ = auVar21._24_4_ * auVar145._24_4_;
          auVar38._28_4_ = auVar121._28_4_;
          auVar140 = vfmsub231ps_fma(auVar38,auVar144,auVar22);
          auVar147._0_4_ = auVar22._0_4_ * auVar122._0_4_;
          auVar147._4_4_ = auVar22._4_4_ * auVar122._4_4_;
          auVar147._8_4_ = auVar22._8_4_ * auVar122._8_4_;
          auVar147._12_4_ = auVar22._12_4_ * auVar122._12_4_;
          auVar147._16_4_ = auVar22._16_4_ * auVar122._16_4_;
          auVar147._20_4_ = auVar22._20_4_ * auVar122._20_4_;
          auVar147._24_4_ = auVar22._24_4_ * auVar122._24_4_;
          auVar147._28_4_ = 0;
          auVar112 = vfmsub231ps_fma(auVar147,auVar20,auVar145);
          auVar39._4_4_ = auVar20._4_4_ * auVar144._4_4_;
          auVar39._0_4_ = auVar20._0_4_ * auVar144._0_4_;
          auVar39._8_4_ = auVar20._8_4_ * auVar144._8_4_;
          auVar39._12_4_ = auVar20._12_4_ * auVar144._12_4_;
          auVar39._16_4_ = auVar20._16_4_ * auVar144._16_4_;
          auVar39._20_4_ = auVar20._20_4_ * auVar144._20_4_;
          auVar39._24_4_ = auVar20._24_4_ * auVar144._24_4_;
          auVar39._28_4_ = auVar206._28_4_;
          auVar186 = vfmsub231ps_fma(auVar39,auVar122,auVar21);
          auVar117 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar112),ZEXT1632(auVar186));
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT1632(auVar140),ZEXT832(0) << 0x20);
          auVar121 = vrcpps_avx(ZEXT1632(auVar187));
          auVar230._8_4_ = 0x3f800000;
          auVar230._0_8_ = &DAT_3f8000003f800000;
          auVar230._12_4_ = 0x3f800000;
          auVar230._16_4_ = 0x3f800000;
          auVar230._20_4_ = 0x3f800000;
          auVar230._24_4_ = 0x3f800000;
          auVar230._28_4_ = 0x3f800000;
          auVar117 = vfnmadd213ps_fma(auVar121,ZEXT1632(auVar187),auVar230);
          auVar117 = vfmadd132ps_fma(ZEXT1632(auVar117),auVar121,auVar121);
          auVar208._0_4_ = auVar186._0_4_ * auVar203._0_4_;
          auVar208._4_4_ = auVar186._4_4_ * auVar203._4_4_;
          auVar208._8_4_ = auVar186._8_4_ * auVar203._8_4_;
          auVar208._12_4_ = auVar186._12_4_ * auVar203._12_4_;
          auVar208._16_4_ = auVar203._16_4_ * 0.0;
          auVar208._20_4_ = auVar203._20_4_ * 0.0;
          auVar208._24_4_ = auVar203._24_4_ * 0.0;
          auVar208._28_4_ = 0;
          auVar112 = vfmadd231ps_fma(auVar208,auVar149,ZEXT1632(auVar112));
          auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),ZEXT1632(auVar140),auVar120);
          fVar158 = auVar117._0_4_;
          fVar134 = auVar117._4_4_;
          fVar135 = auVar117._8_4_;
          fVar136 = auVar117._12_4_;
          auVar203 = ZEXT1632(CONCAT412(fVar136 * auVar112._12_4_,
                                        CONCAT48(fVar135 * auVar112._8_4_,
                                                 CONCAT44(fVar134 * auVar112._4_4_,
                                                          fVar158 * auVar112._0_4_))));
          auVar128._4_4_ = uVar106;
          auVar128._0_4_ = uVar106;
          auVar128._8_4_ = uVar106;
          auVar128._12_4_ = uVar106;
          auVar128._16_4_ = uVar106;
          auVar128._20_4_ = uVar106;
          auVar128._24_4_ = uVar106;
          auVar128._28_4_ = uVar106;
          uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar148._4_4_ = uVar110;
          auVar148._0_4_ = uVar110;
          auVar148._8_4_ = uVar110;
          auVar148._12_4_ = uVar110;
          auVar148._16_4_ = uVar110;
          auVar148._20_4_ = uVar110;
          auVar148._24_4_ = uVar110;
          auVar148._28_4_ = uVar110;
          auVar120 = vcmpps_avx(auVar128,auVar203,2);
          auVar149 = vcmpps_avx(auVar203,auVar148,2);
          auVar120 = vandps_avx(auVar149,auVar120);
          auVar117 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
          auVar160 = vpand_avx(auVar160,auVar117);
          auVar120 = vpmovsxwd_avx2(auVar160);
          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar120 >> 0x7f,0) == '\0') &&
                (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar120 >> 0xbf,0) == '\0') &&
              (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar120[0x1f]) goto LAB_016ce831;
          auVar120 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar187),4);
          auVar117 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
          auVar160 = vpand_avx(auVar160,auVar117);
          auVar120 = vpmovsxwd_avx2(auVar160);
          auVar210 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar231 = ZEXT3264(auVar129);
          auVar226 = ZEXT3264(auVar132);
          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar120 >> 0x7f,0) != '\0') ||
                (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar120 >> 0xbf,0) != '\0') ||
              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar120[0x1f] < '\0') {
            auVar129 = ZEXT1632(CONCAT412(fVar136 * auVar113._12_4_,
                                          CONCAT48(fVar135 * auVar113._8_4_,
                                                   CONCAT44(fVar134 * auVar113._4_4_,
                                                            fVar158 * auVar113._0_4_))));
            auVar149 = ZEXT1632(CONCAT412(fVar136 * auVar141._12_4_,
                                          CONCAT48(fVar135 * auVar141._8_4_,
                                                   CONCAT44(fVar134 * auVar141._4_4_,
                                                            fVar158 * auVar141._0_4_))));
            auVar193._8_4_ = 0x3f800000;
            auVar193._0_8_ = &DAT_3f8000003f800000;
            auVar193._12_4_ = 0x3f800000;
            auVar193._16_4_ = 0x3f800000;
            auVar193._20_4_ = 0x3f800000;
            auVar193._24_4_ = 0x3f800000;
            auVar193._28_4_ = 0x3f800000;
            auVar132 = vsubps_avx(auVar193,auVar129);
            auVar176 = ZEXT3264(auVar132);
            auVar132 = vblendvps_avx(auVar132,auVar129,auVar123);
            auVar231 = ZEXT3264(auVar132);
            auVar132 = vsubps_avx(auVar193,auVar149);
            local_380 = vblendvps_avx(auVar132,auVar149,auVar123);
            auVar210 = ZEXT3264(auVar120);
            auVar226 = ZEXT3264(auVar203);
          }
        }
        auVar239 = ZEXT3264(_local_6c0);
        auVar120 = auVar210._0_32_;
        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar120 >> 0x7f,0) == '\0') &&
              (auVar210 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar120 >> 0xbf,0) == '\0') &&
            (auVar210 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar210[0x1f]) {
          auVar157 = ZEXT3264(local_6e0);
          auVar214 = ZEXT3264(CONCAT428(local_760,
                                        CONCAT424(local_760,
                                                  CONCAT420(local_760,
                                                            CONCAT416(local_760,
                                                                      CONCAT412(local_760,
                                                                                CONCAT48(local_760,
                                                                                         CONCAT44(
                                                  local_760,local_760))))))));
          auVar220 = ZEXT3264(local_780);
          auVar210 = ZEXT3264(local_740);
        }
        else {
          auVar132 = vsubps_avx(ZEXT1632(auVar177),auVar207);
          auVar203 = auVar231._0_32_;
          auVar160 = vfmadd213ps_fma(auVar132,auVar203,auVar207);
          fVar158 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar132._4_4_ = (auVar160._4_4_ + auVar160._4_4_) * fVar158;
          auVar132._0_4_ = (auVar160._0_4_ + auVar160._0_4_) * fVar158;
          auVar132._8_4_ = (auVar160._8_4_ + auVar160._8_4_) * fVar158;
          auVar132._12_4_ = (auVar160._12_4_ + auVar160._12_4_) * fVar158;
          auVar132._16_4_ = fVar158 * 0.0;
          auVar132._20_4_ = fVar158 * 0.0;
          auVar132._24_4_ = fVar158 * 0.0;
          auVar132._28_4_ = 0;
          auVar149 = auVar226._0_32_;
          auVar132 = vcmpps_avx(auVar149,auVar132,6);
          auVar129 = auVar120 & auVar132;
          auVar214 = ZEXT3264(CONCAT428(local_760,
                                        CONCAT424(local_760,
                                                  CONCAT420(local_760,
                                                            CONCAT416(local_760,
                                                                      CONCAT412(local_760,
                                                                                CONCAT48(local_760,
                                                                                         CONCAT44(
                                                  local_760,local_760))))))));
          auVar220 = ZEXT3264(local_780);
          auVar210 = ZEXT3264(local_740);
          if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar129 >> 0x7f,0) != '\0') ||
                (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar129 >> 0xbf,0) != '\0') ||
              (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar129[0x1f] < '\0') {
            local_420 = vandps_avx(auVar132,auVar120);
            auVar129._8_4_ = 0xbf800000;
            auVar129._0_8_ = 0xbf800000bf800000;
            auVar129._12_4_ = 0xbf800000;
            auVar129._16_4_ = 0xbf800000;
            auVar129._20_4_ = 0xbf800000;
            auVar129._24_4_ = 0xbf800000;
            auVar129._28_4_ = 0xbf800000;
            auVar172._8_4_ = 0x40000000;
            auVar172._0_8_ = 0x4000000040000000;
            auVar172._12_4_ = 0x40000000;
            auVar172._16_4_ = 0x40000000;
            auVar172._20_4_ = 0x40000000;
            auVar172._24_4_ = 0x40000000;
            auVar172._28_4_ = 0x40000000;
            auVar176 = ZEXT3264(auVar172);
            auVar160 = vfmadd213ps_fma(local_380,auVar172,auVar129);
            local_4c0 = ZEXT1632(auVar160);
            local_380 = local_4c0;
            auVar120 = local_380;
            local_480 = 0;
            local_380 = auVar120;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar158 = 1.0 / auVar124._0_4_;
              local_400[0] = fVar158 * (auVar231._0_4_ + 0.0);
              local_400[1] = fVar158 * (auVar231._4_4_ + 1.0);
              local_400[2] = fVar158 * (auVar231._8_4_ + 2.0);
              local_400[3] = fVar158 * (auVar231._12_4_ + 3.0);
              fStack_3f0 = fVar158 * (auVar231._16_4_ + 4.0);
              fStack_3ec = fVar158 * (auVar231._20_4_ + 5.0);
              fStack_3e8 = fVar158 * (auVar231._24_4_ + 6.0);
              fStack_3e4 = auVar231._28_4_ + 7.0;
              local_380._0_8_ = auVar160._0_8_;
              local_380._8_8_ = auVar160._8_8_;
              local_3e0 = local_380._0_8_;
              uStack_3d8 = local_380._8_8_;
              uStack_3d0 = 0;
              uStack_3c8 = 0;
              local_3c0 = auVar149;
              auVar150._8_4_ = 0x7f800000;
              auVar150._0_8_ = 0x7f8000007f800000;
              auVar150._12_4_ = 0x7f800000;
              auVar150._16_4_ = 0x7f800000;
              auVar150._20_4_ = 0x7f800000;
              auVar150._24_4_ = 0x7f800000;
              auVar150._28_4_ = 0x7f800000;
              auVar120 = vblendvps_avx(auVar150,auVar149,local_420);
              auVar132 = vshufps_avx(auVar120,auVar120,0xb1);
              auVar132 = vminps_avx(auVar120,auVar132);
              auVar129 = vshufpd_avx(auVar132,auVar132,5);
              auVar132 = vminps_avx(auVar132,auVar129);
              auVar129 = vpermpd_avx2(auVar132,0x4e);
              auVar132 = vminps_avx(auVar132,auVar129);
              auVar132 = vcmpps_avx(auVar120,auVar132,0);
              auVar129 = local_420 & auVar132;
              auVar120 = local_420;
              if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar129 >> 0x7f,0) != '\0') ||
                    (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar129 >> 0xbf,0) != '\0') ||
                  (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar129[0x1f] < '\0') {
                auVar120 = vandps_avx(auVar132,local_420);
              }
              uVar104 = vmovmskps_avx(auVar120);
              uVar106 = 0;
              for (; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x80000000) {
                uVar106 = uVar106 + 1;
              }
              uVar105 = (ulong)uVar106;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar158 = local_400[uVar105];
                fVar134 = 1.0 - fVar158;
                auVar117 = ZEXT416((uint)fVar158);
                auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar117,
                                          ZEXT416(0xc0a00000));
                auVar160 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * 3.0)),
                                           ZEXT416((uint)(fVar158 + fVar158)),auVar13);
                auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar117,
                                          ZEXT416(0x40000000));
                auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * fVar134 * -3.0)),
                                          ZEXT416((uint)(fVar134 + fVar134)),auVar13);
                auVar113 = vfnmadd231ss_fma(ZEXT416((uint)(fVar158 * (fVar134 + fVar134))),
                                            ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
                auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158)),auVar117,
                                           ZEXT416((uint)(fVar134 * -2.0)));
                fVar134 = auVar13._0_4_ * 0.5;
                fVar135 = auVar117._0_4_ * 0.5;
                auVar178._0_4_ = fVar135 * local_7e0;
                auVar178._4_4_ = fVar135 * fStack_7dc;
                auVar178._8_4_ = fVar135 * fStack_7d8;
                auVar178._12_4_ = fVar135 * fStack_7d4;
                auVar142._4_4_ = fVar134;
                auVar142._0_4_ = fVar134;
                auVar142._8_4_ = fVar134;
                auVar142._12_4_ = fVar134;
                auVar13 = vfmadd132ps_fma(auVar142,auVar178,*pauVar3);
                fVar134 = auVar160._0_4_ * 0.5;
                auVar179._4_4_ = fVar134;
                auVar179._0_4_ = fVar134;
                auVar179._8_4_ = fVar134;
                auVar179._12_4_ = fVar134;
                auVar13 = vfmadd132ps_fma(auVar179,auVar13,*pauVar2);
                uVar110 = *(undefined4 *)((long)&local_3e0 + uVar105 * 4);
                fVar134 = auVar113._0_4_ * 0.5;
                auVar210 = ZEXT3264(local_740);
                auVar161._4_4_ = fVar134;
                auVar161._0_4_ = fVar134;
                auVar161._8_4_ = fVar134;
                auVar161._12_4_ = fVar134;
                auVar13 = vfmadd132ps_fma(auVar161,auVar13,*pauVar1);
                auVar176 = ZEXT1664(auVar13);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar105 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar13._0_4_;
                uVar232 = vextractps_avx(auVar13,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar232;
                uVar232 = vextractps_avx(auVar13,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar232;
                *(float *)(ray + k * 4 + 0x1e0) = fVar158;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar110;
                *(uint *)(ray + k * 4 + 0x220) = uVar10;
                *(uint *)(ray + k * 4 + 0x240) = uVar102;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_800 = CONCAT44(uVar102,uVar102);
                uStack_7f8._0_4_ = uVar102;
                uStack_7f8._4_4_ = uVar102;
                uStack_7f0._0_4_ = uVar102;
                uStack_7f0._4_4_ = uVar102;
                auVar101 = _local_800;
                uStack_7e8._0_4_ = uVar102;
                uStack_7e8._4_4_ = uVar102;
                auVar120 = _local_800;
                local_6a0._4_4_ = uVar10;
                local_6a0._0_4_ = uVar10;
                uStack_698._0_4_ = (float)uVar10;
                uStack_698._4_4_ = (float)uVar10;
                uStack_690._0_4_ = uVar10;
                uStack_690._4_4_ = uVar10;
                uStack_688._0_4_ = uVar10;
                uStack_688._4_4_ = uVar10;
                local_680 = ZEXT1632(*pauVar2);
                local_580 = ZEXT1632(*pauVar3);
                _local_5a0 = ZEXT1632(*pauVar4);
                local_640 = local_420;
                _local_5c0 = auVar151;
                local_4e0 = auVar203;
                local_4a0 = auVar149;
                local_47c = iVar103;
                local_470 = uVar84;
                uStack_468 = uVar85;
                local_460 = uVar86;
                uStack_458 = uVar87;
                local_450 = uVar88;
                uStack_448 = uVar89;
                local_440 = uVar90;
                uStack_438 = uVar91;
                do {
                  uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar158 = local_400[uVar105];
                  auVar119._4_4_ = fVar158;
                  auVar119._0_4_ = fVar158;
                  auVar119._8_4_ = fVar158;
                  auVar119._12_4_ = fVar158;
                  local_260._16_4_ = fVar158;
                  local_260._0_16_ = auVar119;
                  local_260._20_4_ = fVar158;
                  local_260._24_4_ = fVar158;
                  local_260._28_4_ = fVar158;
                  uVar232 = *(undefined4 *)((long)&local_3e0 + uVar105 * 4);
                  local_240._4_4_ = uVar232;
                  local_240._0_4_ = uVar232;
                  local_240._8_4_ = uVar232;
                  local_240._12_4_ = uVar232;
                  local_240._16_4_ = uVar232;
                  local_240._20_4_ = uVar232;
                  local_240._24_4_ = uVar232;
                  local_240._28_4_ = uVar232;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar105 * 4);
                  fVar134 = 1.0 - fVar158;
                  auVar160 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar119,
                                             ZEXT416(0xc0a00000));
                  auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * 3.0)),
                                             ZEXT416((uint)(fVar158 + fVar158)),auVar160);
                  auVar160 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar119,
                                             ZEXT416(0x40000000));
                  auVar160 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * fVar134 * -3.0)),
                                             ZEXT416((uint)(fVar134 + fVar134)),auVar160);
                  auVar141 = vfnmadd231ss_fma(ZEXT416((uint)(fVar158 * (fVar134 + fVar134))),
                                              ZEXT416((uint)fVar134),ZEXT416((uint)fVar134));
                  auVar113 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158)),auVar119,
                                             ZEXT416((uint)(fVar134 * -2.0)));
                  fVar158 = auVar160._0_4_ * 0.5;
                  fVar134 = auVar113._0_4_ * 0.5;
                  auVar191._0_4_ = fVar134 * (float)local_5a0._0_4_;
                  auVar191._4_4_ = fVar134 * (float)local_5a0._4_4_;
                  auVar191._8_4_ = fVar134 * fStack_598;
                  auVar191._12_4_ = fVar134 * fStack_594;
                  auVar166._4_4_ = fVar158;
                  auVar166._0_4_ = fVar158;
                  auVar166._8_4_ = fVar158;
                  auVar166._12_4_ = fVar158;
                  auVar160 = vfmadd132ps_fma(auVar166,auVar191,local_580._0_16_);
                  fVar158 = auVar117._0_4_ * 0.5;
                  auVar192._4_4_ = fVar158;
                  auVar192._0_4_ = fVar158;
                  auVar192._8_4_ = fVar158;
                  auVar192._12_4_ = fVar158;
                  auVar160 = vfmadd132ps_fma(auVar192,auVar160,local_680._0_16_);
                  local_7b0.context = context->user;
                  fVar158 = auVar141._0_4_ * 0.5;
                  auVar167._4_4_ = fVar158;
                  auVar167._0_4_ = fVar158;
                  auVar167._8_4_ = fVar158;
                  auVar167._12_4_ = fVar158;
                  auVar117 = vfmadd132ps_fma(auVar167,auVar160,auVar13);
                  local_2c0 = auVar117._0_4_;
                  uStack_2bc = local_2c0;
                  uStack_2b8 = local_2c0;
                  uStack_2b4 = local_2c0;
                  uStack_2b0 = local_2c0;
                  uStack_2ac = local_2c0;
                  uStack_2a8 = local_2c0;
                  uStack_2a4 = local_2c0;
                  auVar160 = vmovshdup_avx(auVar117);
                  local_2a0._8_8_ = auVar160._0_8_;
                  local_2a0._0_8_ = local_2a0._8_8_;
                  local_2a0._16_8_ = local_2a0._8_8_;
                  local_2a0._24_8_ = local_2a0._8_8_;
                  auVar160 = vshufps_avx(auVar117,auVar117,0xaa);
                  auVar168._0_8_ = auVar160._0_8_;
                  auVar168._8_8_ = auVar168._0_8_;
                  auVar151._16_8_ = auVar168._0_8_;
                  auVar151._0_16_ = auVar168;
                  auVar151._24_8_ = auVar168._0_8_;
                  local_280 = auVar151;
                  local_220 = local_6a0;
                  uStack_218 = uStack_698;
                  uStack_210 = uStack_690;
                  uStack_208 = uStack_688;
                  uStack_7f0 = auVar101._16_8_;
                  uStack_7e8 = auVar120._24_8_;
                  local_200 = local_800;
                  uStack_1f8 = uStack_7f8;
                  uStack_1f0 = uStack_7f0;
                  uStack_1e8 = uStack_7e8;
                  auVar132 = vpcmpeqd_avx2(local_240,local_240);
                  local_708[1] = auVar132;
                  *local_708 = auVar132;
                  local_1e0 = (local_7b0.context)->instID[0];
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = (local_7b0.context)->instPrimID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_620 = local_300._0_8_;
                  uStack_618 = local_300._8_8_;
                  uStack_610 = local_300._16_8_;
                  uStack_608 = local_300._24_8_;
                  local_7b0.valid = (int *)&local_620;
                  local_7b0.geometryUserPtr = pGVar11->userPtr;
                  local_7b0.hit = (RTCHitN *)&local_2c0;
                  local_7b0.N = 8;
                  local_7b0.ray = (RTCRayN *)ray;
                  if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar151 = ZEXT1632(auVar168);
                    (*pGVar11->intersectionFilterN)(&local_7b0);
                    auVar176._8_56_ = extraout_var_00;
                    auVar176._0_8_ = extraout_XMM1_Qa_00;
                    auVar239 = ZEXT3264(_local_6c0);
                    auVar220 = ZEXT3264(local_780);
                    auVar226 = ZEXT3264(auVar149);
                    auVar231 = ZEXT3264(auVar203);
                    auVar132 = vpcmpeqd_avx2(auVar176._0_32_,auVar176._0_32_);
                  }
                  auVar96._8_8_ = uStack_618;
                  auVar96._0_8_ = local_620;
                  auVar96._16_8_ = uStack_610;
                  auVar96._24_8_ = uStack_608;
                  auVar121 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar96);
                  auVar129 = auVar132 & ~auVar121;
                  if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar129 >> 0x7f,0) == '\0') &&
                        (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar129 >> 0xbf,0) == '\0') &&
                      (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar129[0x1f]) {
                    auVar176 = ZEXT3264(auVar121 ^ auVar132);
                    auVar214 = ZEXT3264(CONCAT428(fStack_744,
                                                  CONCAT424(fStack_748,
                                                            CONCAT420(fStack_74c,
                                                                      CONCAT416(fStack_750,
                                                                                CONCAT412(fStack_754
                                                                                          ,CONCAT48(
                                                  fStack_758,CONCAT44(fStack_75c,local_760))))))));
                    auVar210 = ZEXT3264(local_740);
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar151 = ZEXT1632(auVar151._0_16_);
                      (*p_Var12)(&local_7b0);
                      auVar239 = ZEXT3264(_local_6c0);
                      auVar220 = ZEXT3264(local_780);
                      auVar226 = ZEXT3264(auVar149);
                      auVar231 = ZEXT3264(auVar203);
                    }
                    auVar97._8_8_ = uStack_618;
                    auVar97._0_8_ = local_620;
                    auVar97._16_8_ = uStack_610;
                    auVar97._24_8_ = uStack_608;
                    auVar129 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar97);
                    auVar121 = vpcmpeqd_avx2(auVar151,auVar151);
                    auVar176 = ZEXT3264(auVar129 ^ auVar121);
                    auVar132 = auVar121 & ~auVar129;
                    auVar214 = ZEXT3264(CONCAT428(fStack_744,
                                                  CONCAT424(fStack_748,
                                                            CONCAT420(fStack_74c,
                                                                      CONCAT416(fStack_750,
                                                                                CONCAT412(fStack_754
                                                                                          ,CONCAT48(
                                                  fStack_758,CONCAT44(fStack_75c,local_760))))))));
                    auVar210 = ZEXT3264(local_740);
                    if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar132 >> 0x7f,0) != '\0') ||
                          (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar132 >> 0xbf,0) != '\0') ||
                        (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar132[0x1f] < '\0') {
                      auVar155._0_4_ = auVar129._0_4_ ^ auVar121._0_4_;
                      auVar155._4_4_ = auVar129._4_4_ ^ auVar121._4_4_;
                      auVar155._8_4_ = auVar129._8_4_ ^ auVar121._8_4_;
                      auVar155._12_4_ = auVar129._12_4_ ^ auVar121._12_4_;
                      auVar155._16_4_ = auVar129._16_4_ ^ auVar121._16_4_;
                      auVar155._20_4_ = auVar129._20_4_ ^ auVar121._20_4_;
                      auVar155._24_4_ = auVar129._24_4_ ^ auVar121._24_4_;
                      auVar155._28_4_ = auVar129._28_4_ ^ auVar121._28_4_;
                      auVar132 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])local_7b0.hit);
                      *(undefined1 (*) [32])(local_7b0.ray + 0x180) = auVar132;
                      auVar132 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])
                                                          (local_7b0.hit + 0x20));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x1a0) = auVar132;
                      auVar132 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])
                                                          (local_7b0.hit + 0x40));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x1c0) = auVar132;
                      auVar132 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])
                                                          (local_7b0.hit + 0x60));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x1e0) = auVar132;
                      auVar132 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])
                                                          (local_7b0.hit + 0x80));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x200) = auVar132;
                      auVar132 = vpmaskmovd_avx2(auVar155,*(undefined1 (*) [32])
                                                           (local_7b0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x220) = auVar132;
                      auVar132 = vpmaskmovd_avx2(auVar155,*(undefined1 (*) [32])
                                                           (local_7b0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x240) = auVar132;
                      auVar132 = vpmaskmovd_avx2(auVar155,*(undefined1 (*) [32])
                                                           (local_7b0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x260) = auVar132;
                      auVar132 = vpmaskmovd_avx2(auVar155,*(undefined1 (*) [32])
                                                           (local_7b0.hit + 0x100));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x280) = auVar132;
                    }
                  }
                  auVar132 = auVar176._0_32_;
                  if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar132 >> 0x7f,0) == '\0') &&
                        (auVar176 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                       SUB321(auVar132 >> 0xbf,0) == '\0') &&
                      (auVar176 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                      -1 < auVar176[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar110;
                  }
                  *(undefined4 *)(local_640 + uVar105 * 4) = 0;
                  uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar133._4_4_ = uVar110;
                  auVar133._0_4_ = uVar110;
                  auVar133._8_4_ = uVar110;
                  auVar133._12_4_ = uVar110;
                  auVar133._16_4_ = uVar110;
                  auVar133._20_4_ = uVar110;
                  auVar133._24_4_ = uVar110;
                  auVar133._28_4_ = uVar110;
                  auVar129 = vcmpps_avx(auVar226._0_32_,auVar133,2);
                  auVar132 = vandps_avx(auVar129,local_640);
                  auVar129 = local_640 & auVar129;
                  bVar75 = (auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar76 = (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar74 = (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar73 = SUB321(auVar129 >> 0x7f,0) != '\0';
                  bVar72 = (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar71 = SUB321(auVar129 >> 0xbf,0) != '\0';
                  bVar70 = (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar69 = auVar129[0x1f] < '\0';
                  if (((((((bVar75 || bVar76) || bVar74) || bVar73) || bVar72) || bVar71) || bVar70)
                      || bVar69) {
                    auVar156._8_4_ = 0x7f800000;
                    auVar156._0_8_ = 0x7f8000007f800000;
                    auVar156._12_4_ = 0x7f800000;
                    auVar156._16_4_ = 0x7f800000;
                    auVar156._20_4_ = 0x7f800000;
                    auVar156._24_4_ = 0x7f800000;
                    auVar156._28_4_ = 0x7f800000;
                    auVar129 = vblendvps_avx(auVar156,auVar226._0_32_,auVar132);
                    auVar121 = vshufps_avx(auVar129,auVar129,0xb1);
                    auVar121 = vminps_avx(auVar129,auVar121);
                    auVar206 = vshufpd_avx(auVar121,auVar121,5);
                    auVar121 = vminps_avx(auVar121,auVar206);
                    auVar206 = vpermpd_avx2(auVar121,0x4e);
                    local_640 = vminps_avx(auVar121,auVar206);
                    auVar121 = vcmpps_avx(auVar129,local_640,0);
                    auVar206 = auVar132 & auVar121;
                    auVar129 = auVar132;
                    if ((((((((auVar206 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar206 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar206 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar206 >> 0x7f,0) != '\0') ||
                          (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar206 >> 0xbf,0) != '\0') ||
                        (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar206[0x1f] < '\0') {
                      auVar129 = vandps_avx(auVar121,auVar132);
                    }
                    uVar104 = vmovmskps_avx(auVar129);
                    uVar106 = 0;
                    for (; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x80000000) {
                      uVar106 = uVar106 + 1;
                    }
                    uVar105 = (ulong)uVar106;
                  }
                  auVar176 = ZEXT3264(local_640);
                  local_640 = auVar132;
                } while (((((((bVar75 || bVar76) || bVar74) || bVar73) || bVar72) || bVar71) ||
                         bVar70) || bVar69);
              }
            }
          }
          auVar157 = ZEXT3264(local_6e0);
        }
      }
      if (8 < iVar103) {
        _local_6c0 = auVar239._0_32_;
        local_360._4_4_ = iVar103;
        local_360._0_4_ = iVar103;
        local_360._8_4_ = iVar103;
        local_360._12_4_ = iVar103;
        local_360._16_4_ = iVar103;
        local_360._20_4_ = iVar103;
        local_360._24_4_ = iVar103;
        local_360._28_4_ = iVar103;
        local_120 = fVar159;
        fStack_11c = fVar159;
        fStack_118 = fVar159;
        fStack_114 = fVar159;
        fStack_110 = fVar159;
        fStack_10c = fVar159;
        fStack_108 = fVar159;
        fStack_104 = fVar159;
        local_140 = local_700._0_4_;
        uStack_13c = local_700._0_4_;
        uStack_138 = local_700._0_4_;
        uStack_134 = local_700._0_4_;
        uStack_130 = local_700._0_4_;
        uStack_12c = local_700._0_4_;
        uStack_128 = local_700._0_4_;
        uStack_124 = local_700._0_4_;
        local_160 = 1.0 / (float)local_500._0_4_;
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        fStack_150 = local_160;
        fStack_14c = local_160;
        fStack_148 = local_160;
        fStack_144 = local_160;
        local_180 = uVar102;
        uStack_17c = uVar102;
        uStack_178 = uVar102;
        uStack_174 = uVar102;
        uStack_170 = uVar102;
        uStack_16c = uVar102;
        uStack_168 = uVar102;
        uStack_164 = uVar102;
        local_1a0 = uVar10;
        uStack_19c = uVar10;
        uStack_198 = uVar10;
        uStack_194 = uVar10;
        uStack_190 = uVar10;
        uStack_18c = uVar10;
        uStack_188 = uVar10;
        uStack_184 = uVar10;
        lVar109 = 8;
        auVar132 = auVar231._0_32_;
        auVar120 = auVar226._0_32_;
        do {
          auVar129 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar109 * 4 + lVar23);
          auVar149 = *(undefined1 (*) [32])(lVar23 + 0x22307f0 + lVar109 * 4);
          auVar203 = *(undefined1 (*) [32])(lVar23 + 0x2230c74 + lVar109 * 4);
          pauVar5 = (undefined1 (*) [28])(lVar23 + 0x22310f8 + lVar109 * 4);
          auVar100 = *pauVar5;
          auVar240._0_4_ = auVar214._0_4_ * *(float *)*pauVar5;
          auVar240._4_4_ = auVar214._4_4_ * *(float *)(*pauVar5 + 4);
          auVar240._8_4_ = auVar214._8_4_ * *(float *)(*pauVar5 + 8);
          auVar240._12_4_ = auVar214._12_4_ * *(float *)(*pauVar5 + 0xc);
          auVar240._16_4_ = auVar214._16_4_ * *(float *)(*pauVar5 + 0x10);
          auVar240._20_4_ = auVar214._20_4_ * *(float *)(*pauVar5 + 0x14);
          auVar240._28_36_ = auVar239._28_36_;
          auVar240._24_4_ = auVar214._24_4_ * *(float *)(*pauVar5 + 0x18);
          auVar239._0_4_ = fVar242 * *(float *)*pauVar5;
          auVar239._4_4_ = fVar247 * *(float *)(*pauVar5 + 4);
          auVar239._8_4_ = fVar242 * *(float *)(*pauVar5 + 8);
          auVar239._12_4_ = fVar247 * *(float *)(*pauVar5 + 0xc);
          auVar239._16_4_ = fVar242 * *(float *)(*pauVar5 + 0x10);
          auVar239._20_4_ = fVar247 * *(float *)(*pauVar5 + 0x14);
          auVar239._28_36_ = auVar176._28_36_;
          auVar239._24_4_ = fVar242 * *(float *)(*pauVar5 + 0x18);
          auVar13 = vfmadd231ps_fma(auVar240._0_32_,auVar203,auVar169);
          auVar160 = vfmadd231ps_fma(auVar239._0_32_,auVar203,auVar197);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar149,auVar220._0_32_);
          auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar149,auVar157._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar129,auVar210._0_32_);
          auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar129,local_660);
          auVar121 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar109 * 4 + lVar23);
          auVar206 = *(undefined1 (*) [32])(lVar23 + 0x2232c10 + lVar109 * 4);
          auVar225 = *(undefined1 (*) [32])(lVar23 + 0x2233094 + lVar109 * 4);
          pfVar6 = (float *)(lVar23 + 0x2233518 + lVar109 * 4);
          fVar139 = *pfVar6;
          fVar77 = pfVar6[1];
          fVar78 = pfVar6[2];
          fVar79 = pfVar6[3];
          fVar80 = pfVar6[4];
          fVar81 = pfVar6[5];
          fVar82 = pfVar6[6];
          auVar40._4_4_ = auVar214._4_4_ * fVar77;
          auVar40._0_4_ = auVar214._0_4_ * fVar139;
          auVar40._8_4_ = auVar214._8_4_ * fVar78;
          auVar40._12_4_ = auVar214._12_4_ * fVar79;
          auVar40._16_4_ = auVar214._16_4_ * fVar80;
          auVar40._20_4_ = auVar214._20_4_ * fVar81;
          auVar40._24_4_ = auVar214._24_4_ * fVar82;
          auVar40._28_4_ = local_660._28_4_;
          auVar215._0_4_ = fVar242 * fVar139;
          auVar215._4_4_ = fVar247 * fVar77;
          auVar215._8_4_ = fVar242 * fVar78;
          auVar215._12_4_ = fVar247 * fVar79;
          auVar215._16_4_ = fVar242 * fVar80;
          auVar215._20_4_ = fVar247 * fVar81;
          auVar215._28_36_ = auVar214._28_36_;
          auVar215._24_4_ = fVar242 * fVar82;
          auVar117 = vfmadd231ps_fma(auVar40,auVar225,auVar169);
          auVar113 = vfmadd231ps_fma(auVar215._0_32_,auVar225,auVar197);
          auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar206,auVar220._0_32_);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar206,auVar157._0_32_);
          auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar121,auVar210._0_32_);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar121,local_660);
          _local_5a0 = ZEXT1632(auVar117);
          local_340 = ZEXT1632(auVar13);
          local_680 = vsubps_avx(_local_5a0,local_340);
          local_580 = ZEXT1632(auVar113);
          auVar123 = ZEXT1632(auVar160);
          _local_5c0 = vsubps_avx(local_580,auVar123);
          auVar41._4_4_ = auVar160._4_4_ * local_680._4_4_;
          auVar41._0_4_ = auVar160._0_4_ * local_680._0_4_;
          auVar41._8_4_ = auVar160._8_4_ * local_680._8_4_;
          auVar41._12_4_ = auVar160._12_4_ * local_680._12_4_;
          auVar41._16_4_ = local_680._16_4_ * 0.0;
          auVar41._20_4_ = local_680._20_4_ * 0.0;
          auVar41._24_4_ = local_680._24_4_ * 0.0;
          auVar41._28_4_ = auVar121._28_4_;
          fVar159 = local_5c0._0_4_;
          auVar226._0_4_ = auVar13._0_4_ * fVar159;
          fVar158 = local_5c0._4_4_;
          auVar226._4_4_ = auVar13._4_4_ * fVar158;
          fVar134 = local_5c0._8_4_;
          auVar226._8_4_ = auVar13._8_4_ * fVar134;
          fVar135 = local_5c0._12_4_;
          auVar226._12_4_ = auVar13._12_4_ * fVar135;
          fVar136 = local_5c0._16_4_;
          auVar226._16_4_ = fVar136 * 0.0;
          fVar137 = local_5c0._20_4_;
          auVar226._20_4_ = fVar137 * 0.0;
          fVar138 = local_5c0._24_4_;
          auVar226._28_36_ = auVar157._28_36_;
          auVar226._24_4_ = fVar138 * 0.0;
          auVar239 = ZEXT3264(auVar203);
          auVar130 = vsubps_avx(auVar41,auVar226._0_32_);
          local_8e0 = auVar100._0_4_;
          fStack_8dc = auVar100._4_4_;
          fStack_8d8 = auVar100._8_4_;
          fStack_8d4 = auVar100._12_4_;
          fStack_8d0 = auVar100._16_4_;
          fStack_8cc = auVar100._20_4_;
          fStack_8c8 = auVar100._24_4_;
          auVar173._0_4_ = (float)local_e0 * local_8e0;
          auVar173._4_4_ = local_e0._4_4_ * fStack_8dc;
          auVar173._8_4_ = (float)uStack_d8 * fStack_8d8;
          auVar173._12_4_ = uStack_d8._4_4_ * fStack_8d4;
          auVar173._16_4_ = (float)uStack_d0 * fStack_8d0;
          auVar173._20_4_ = uStack_d0._4_4_ * fStack_8cc;
          auVar173._24_4_ = (float)uStack_c8 * fStack_8c8;
          auVar173._28_4_ = 0;
          auVar13 = vfmadd231ps_fma(auVar173,auVar203,local_c0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar149,local_a0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_80,auVar129);
          auVar176 = ZEXT1664(auVar13);
          auVar42._4_4_ = local_e0._4_4_ * fVar77;
          auVar42._0_4_ = (float)local_e0 * fVar139;
          auVar42._8_4_ = (float)uStack_d8 * fVar78;
          auVar42._12_4_ = uStack_d8._4_4_ * fVar79;
          auVar42._16_4_ = (float)uStack_d0 * fVar80;
          auVar42._20_4_ = uStack_d0._4_4_ * fVar81;
          auVar42._24_4_ = (float)uStack_c8 * fVar82;
          auVar42._28_4_ = uStack_c8._4_4_;
          auVar160 = vfmadd231ps_fma(auVar42,auVar225,local_c0);
          auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar206,local_a0);
          auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar121,local_80);
          auVar43._4_4_ = fVar158 * fVar158;
          auVar43._0_4_ = fVar159 * fVar159;
          auVar43._8_4_ = fVar134 * fVar134;
          auVar43._12_4_ = fVar135 * fVar135;
          auVar43._16_4_ = fVar136 * fVar136;
          auVar43._20_4_ = fVar137 * fVar137;
          auVar43._24_4_ = fVar138 * fVar138;
          auVar43._28_4_ = local_80._28_4_;
          auVar117 = vfmadd231ps_fma(auVar43,local_680,local_680);
          auVar151 = ZEXT1632(auVar160);
          auVar199 = vmaxps_avx(ZEXT1632(auVar13),auVar151);
          auVar222._0_4_ = auVar199._0_4_ * auVar199._0_4_ * auVar117._0_4_;
          auVar222._4_4_ = auVar199._4_4_ * auVar199._4_4_ * auVar117._4_4_;
          auVar222._8_4_ = auVar199._8_4_ * auVar199._8_4_ * auVar117._8_4_;
          auVar222._12_4_ = auVar199._12_4_ * auVar199._12_4_ * auVar117._12_4_;
          auVar222._16_4_ = auVar199._16_4_ * auVar199._16_4_ * 0.0;
          auVar222._20_4_ = auVar199._20_4_ * auVar199._20_4_ * 0.0;
          auVar222._24_4_ = auVar199._24_4_ * auVar199._24_4_ * 0.0;
          auVar222._28_4_ = 0;
          auVar44._4_4_ = auVar130._4_4_ * auVar130._4_4_;
          auVar44._0_4_ = auVar130._0_4_ * auVar130._0_4_;
          auVar44._8_4_ = auVar130._8_4_ * auVar130._8_4_;
          auVar44._12_4_ = auVar130._12_4_ * auVar130._12_4_;
          auVar44._16_4_ = auVar130._16_4_ * auVar130._16_4_;
          auVar44._20_4_ = auVar130._20_4_ * auVar130._20_4_;
          auVar44._24_4_ = auVar130._24_4_ * auVar130._24_4_;
          auVar44._28_4_ = pfVar6[7];
          auVar199 = vcmpps_avx(auVar44,auVar222,2);
          local_480 = (int)lVar109;
          auVar223._4_4_ = local_480;
          auVar223._0_4_ = local_480;
          auVar223._8_4_ = local_480;
          auVar223._12_4_ = local_480;
          auVar223._16_4_ = local_480;
          auVar223._20_4_ = local_480;
          auVar223._24_4_ = local_480;
          auVar223._28_4_ = local_480;
          auVar130 = vpor_avx2(auVar223,_DAT_0205a920);
          auVar19 = vpcmpgtd_avx2(local_360,auVar130);
          auVar130 = auVar19 & auVar199;
          if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar130 >> 0x7f,0) == '\0') &&
                (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar130 >> 0xbf,0) == '\0') &&
              (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar130[0x1f]) {
LAB_016cdf69:
            auVar214 = ZEXT3264(CONCAT428(fStack_744,
                                          CONCAT424(fStack_748,
                                                    CONCAT420(fStack_74c,
                                                              CONCAT416(fStack_750,
                                                                        CONCAT412(fStack_754,
                                                                                  CONCAT48(
                                                  fStack_758,CONCAT44(fStack_75c,local_760))))))));
            auVar220 = ZEXT3264(local_780);
            auVar210 = ZEXT3264(local_740);
          }
          else {
            local_500 = vandps_avx(auVar19,auVar199);
            auVar45._4_4_ = (float)local_6c0._4_4_ * fVar77;
            auVar45._0_4_ = (float)local_6c0._0_4_ * fVar139;
            auVar45._8_4_ = fStack_6b8 * fVar78;
            auVar45._12_4_ = fStack_6b4 * fVar79;
            auVar45._16_4_ = fStack_6b0 * fVar80;
            auVar45._20_4_ = fStack_6ac * fVar81;
            auVar45._24_4_ = fStack_6a8 * fVar82;
            auVar45._28_4_ = auVar199._28_4_;
            auVar160 = vfmadd213ps_fma(auVar225,local_2e0,auVar45);
            auVar160 = vfmadd213ps_fma(auVar206,local_540,ZEXT1632(auVar160));
            auVar160 = vfmadd132ps_fma(auVar121,ZEXT1632(auVar160),local_560);
            auVar46._4_4_ = (float)local_6c0._4_4_ * fStack_8dc;
            auVar46._0_4_ = (float)local_6c0._0_4_ * local_8e0;
            auVar46._8_4_ = fStack_6b8 * fStack_8d8;
            auVar46._12_4_ = fStack_6b4 * fStack_8d4;
            auVar46._16_4_ = fStack_6b0 * fStack_8d0;
            auVar46._20_4_ = fStack_6ac * fStack_8cc;
            auVar46._24_4_ = fStack_6a8 * fStack_8c8;
            auVar46._28_4_ = auVar199._28_4_;
            auVar117 = vfmadd213ps_fma(auVar203,local_2e0,auVar46);
            auVar117 = vfmadd213ps_fma(auVar149,local_540,ZEXT1632(auVar117));
            auVar149 = *(undefined1 (*) [32])(lVar23 + 0x223157c + lVar109 * 4);
            auVar203 = *(undefined1 (*) [32])(lVar23 + 0x2231a00 + lVar109 * 4);
            auVar121 = *(undefined1 (*) [32])(lVar23 + 0x2231e84 + lVar109 * 4);
            pfVar6 = (float *)(lVar23 + 0x2232308 + lVar109 * 4);
            fVar159 = *pfVar6;
            fVar158 = pfVar6[1];
            fVar134 = pfVar6[2];
            fVar135 = pfVar6[3];
            fVar136 = pfVar6[4];
            fVar137 = pfVar6[5];
            fVar138 = pfVar6[6];
            auVar218._0_4_ = local_760 * fVar159;
            auVar218._4_4_ = fStack_75c * fVar158;
            auVar218._8_4_ = fStack_758 * fVar134;
            auVar218._12_4_ = fStack_754 * fVar135;
            auVar218._16_4_ = fStack_750 * fVar136;
            auVar218._20_4_ = fStack_74c * fVar137;
            auVar218._24_4_ = fStack_748 * fVar138;
            auVar218._28_4_ = 0;
            auVar237._0_4_ = fVar242 * fVar159;
            auVar237._4_4_ = fVar247 * fVar158;
            auVar237._8_4_ = fVar242 * fVar134;
            auVar237._12_4_ = fVar247 * fVar135;
            auVar237._16_4_ = fVar242 * fVar136;
            auVar237._20_4_ = fVar247 * fVar137;
            auVar237._24_4_ = fVar242 * fVar138;
            auVar237._28_4_ = 0;
            auVar47._4_4_ = fVar158 * (float)local_6c0._4_4_;
            auVar47._0_4_ = fVar159 * (float)local_6c0._0_4_;
            auVar47._8_4_ = fVar134 * fStack_6b8;
            auVar47._12_4_ = fVar135 * fStack_6b4;
            auVar47._16_4_ = fVar136 * fStack_6b0;
            auVar47._20_4_ = fVar137 * fStack_6ac;
            auVar47._24_4_ = fVar138 * fStack_6a8;
            auVar47._28_4_ = pfVar6[7];
            auVar113 = vfmadd231ps_fma(auVar218,auVar121,auVar169);
            auVar141 = vfmadd231ps_fma(auVar237,auVar121,auVar197);
            auVar177 = vfmadd231ps_fma(auVar47,local_2e0,auVar121);
            auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar203,local_780);
            auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar203,local_6e0);
            auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),local_540,auVar203);
            auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar149,local_740);
            auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar149,local_660);
            auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),local_560,auVar149);
            pfVar6 = (float *)(lVar23 + 0x2234728 + lVar109 * 4);
            fVar159 = *pfVar6;
            fVar158 = pfVar6[1];
            fVar134 = pfVar6[2];
            fVar135 = pfVar6[3];
            fVar136 = pfVar6[4];
            fVar137 = pfVar6[5];
            fVar138 = pfVar6[6];
            auVar48._4_4_ = fStack_75c * fVar158;
            auVar48._0_4_ = local_760 * fVar159;
            auVar48._8_4_ = fStack_758 * fVar134;
            auVar48._12_4_ = fStack_754 * fVar135;
            auVar48._16_4_ = fStack_750 * fVar136;
            auVar48._20_4_ = fStack_74c * fVar137;
            auVar48._24_4_ = fStack_748 * fVar138;
            auVar48._28_4_ = fStack_744;
            auVar49._4_4_ = fVar247 * fVar158;
            auVar49._0_4_ = fVar242 * fVar159;
            auVar49._8_4_ = fVar242 * fVar134;
            auVar49._12_4_ = fVar247 * fVar135;
            auVar49._16_4_ = fVar242 * fVar136;
            auVar49._20_4_ = fVar247 * fVar137;
            auVar49._24_4_ = fVar242 * fVar138;
            auVar49._28_4_ = fVar247;
            auVar50._4_4_ = fVar158 * (float)local_6c0._4_4_;
            auVar50._0_4_ = fVar159 * (float)local_6c0._0_4_;
            auVar50._8_4_ = fVar134 * fStack_6b8;
            auVar50._12_4_ = fVar135 * fStack_6b4;
            auVar50._16_4_ = fVar136 * fStack_6b0;
            auVar50._20_4_ = fVar137 * fStack_6ac;
            auVar50._24_4_ = fVar138 * fStack_6a8;
            auVar50._28_4_ = pfVar6[7];
            auVar149 = *(undefined1 (*) [32])(lVar23 + 0x22342a4 + lVar109 * 4);
            auVar187 = vfmadd231ps_fma(auVar48,auVar149,auVar169);
            auVar112 = vfmadd231ps_fma(auVar49,auVar149,auVar197);
            auVar140 = vfmadd231ps_fma(auVar50,local_2e0,auVar149);
            auVar149 = *(undefined1 (*) [32])(lVar23 + 0x2233e20 + lVar109 * 4);
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar149,local_780);
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar149,local_6e0);
            auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),local_540,auVar149);
            auVar149 = *(undefined1 (*) [32])(lVar23 + 0x223399c + lVar109 * 4);
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar149,local_740);
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar149,local_660);
            auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),local_560,auVar149);
            auVar224._8_4_ = 0x7fffffff;
            auVar224._0_8_ = 0x7fffffff7fffffff;
            auVar224._12_4_ = 0x7fffffff;
            auVar224._16_4_ = 0x7fffffff;
            auVar224._20_4_ = 0x7fffffff;
            auVar224._24_4_ = 0x7fffffff;
            auVar224._28_4_ = 0x7fffffff;
            auVar149 = vandps_avx(ZEXT1632(auVar113),auVar224);
            auVar203 = vandps_avx(ZEXT1632(auVar141),auVar224);
            auVar203 = vmaxps_avx(auVar149,auVar203);
            auVar149 = vandps_avx(ZEXT1632(auVar177),auVar224);
            auVar149 = vmaxps_avx(auVar203,auVar149);
            auVar99._4_4_ = fStack_11c;
            auVar99._0_4_ = local_120;
            auVar99._8_4_ = fStack_118;
            auVar99._12_4_ = fStack_114;
            auVar99._16_4_ = fStack_110;
            auVar99._20_4_ = fStack_10c;
            auVar99._24_4_ = fStack_108;
            auVar99._28_4_ = fStack_104;
            auVar149 = vcmpps_avx(auVar149,auVar99,1);
            auVar121 = vblendvps_avx(ZEXT1632(auVar113),local_680,auVar149);
            auVar206 = vblendvps_avx(ZEXT1632(auVar141),_local_5c0,auVar149);
            auVar149 = vandps_avx(ZEXT1632(auVar187),auVar224);
            auVar203 = vandps_avx(ZEXT1632(auVar112),auVar224);
            auVar203 = vmaxps_avx(auVar149,auVar203);
            auVar149 = vandps_avx(auVar224,ZEXT1632(auVar140));
            auVar149 = vmaxps_avx(auVar203,auVar149);
            auVar203 = vcmpps_avx(auVar149,auVar99,1);
            auVar149 = vblendvps_avx(ZEXT1632(auVar187),local_680,auVar203);
            auVar203 = vblendvps_avx(ZEXT1632(auVar112),_local_5c0,auVar203);
            auVar117 = vfmadd213ps_fma(auVar129,local_560,ZEXT1632(auVar117));
            auVar113 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
            auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar206,auVar206);
            auVar129 = vrsqrtps_avx(ZEXT1632(auVar113));
            fVar159 = auVar129._0_4_;
            fVar158 = auVar129._4_4_;
            fVar134 = auVar129._8_4_;
            fVar135 = auVar129._12_4_;
            fVar136 = auVar129._16_4_;
            fVar137 = auVar129._20_4_;
            fVar138 = auVar129._24_4_;
            auVar51._4_4_ = fVar158 * fVar158 * fVar158 * auVar113._4_4_ * -0.5;
            auVar51._0_4_ = fVar159 * fVar159 * fVar159 * auVar113._0_4_ * -0.5;
            auVar51._8_4_ = fVar134 * fVar134 * fVar134 * auVar113._8_4_ * -0.5;
            auVar51._12_4_ = fVar135 * fVar135 * fVar135 * auVar113._12_4_ * -0.5;
            auVar51._16_4_ = fVar136 * fVar136 * fVar136 * -0.0;
            auVar51._20_4_ = fVar137 * fVar137 * fVar137 * -0.0;
            auVar51._24_4_ = fVar138 * fVar138 * fVar138 * -0.0;
            auVar51._28_4_ = 0;
            auVar246._8_4_ = 0x3fc00000;
            auVar246._0_8_ = 0x3fc000003fc00000;
            auVar246._12_4_ = 0x3fc00000;
            auVar246._16_4_ = 0x3fc00000;
            auVar246._20_4_ = 0x3fc00000;
            auVar246._24_4_ = 0x3fc00000;
            auVar246._28_4_ = 0x3fc00000;
            auVar113 = vfmadd231ps_fma(auVar51,auVar246,auVar129);
            fVar159 = auVar113._0_4_;
            fVar158 = auVar113._4_4_;
            auVar52._4_4_ = auVar206._4_4_ * fVar158;
            auVar52._0_4_ = auVar206._0_4_ * fVar159;
            fVar134 = auVar113._8_4_;
            auVar52._8_4_ = auVar206._8_4_ * fVar134;
            fVar135 = auVar113._12_4_;
            auVar52._12_4_ = auVar206._12_4_ * fVar135;
            auVar52._16_4_ = auVar206._16_4_ * 0.0;
            auVar52._20_4_ = auVar206._20_4_ * 0.0;
            auVar52._24_4_ = auVar206._24_4_ * 0.0;
            auVar52._28_4_ = auVar129._28_4_;
            auVar53._4_4_ = fVar158 * -auVar121._4_4_;
            auVar53._0_4_ = fVar159 * -auVar121._0_4_;
            auVar53._8_4_ = fVar134 * -auVar121._8_4_;
            auVar53._12_4_ = fVar135 * -auVar121._12_4_;
            auVar53._16_4_ = -auVar121._16_4_ * 0.0;
            auVar53._20_4_ = -auVar121._20_4_ * 0.0;
            auVar53._24_4_ = -auVar121._24_4_ * 0.0;
            auVar53._28_4_ = auVar206._28_4_;
            auVar113 = vfmadd213ps_fma(auVar149,auVar149,ZEXT832(0) << 0x20);
            auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar203,auVar203);
            auVar129 = vrsqrtps_avx(ZEXT1632(auVar113));
            auVar54._28_4_ = local_560._28_4_;
            auVar54._0_28_ =
                 ZEXT1628(CONCAT412(fVar135 * 0.0,
                                    CONCAT48(fVar134 * 0.0,CONCAT44(fVar158 * 0.0,fVar159 * 0.0))));
            fVar159 = auVar129._0_4_;
            fVar158 = auVar129._4_4_;
            fVar134 = auVar129._8_4_;
            fVar135 = auVar129._12_4_;
            fVar136 = auVar129._16_4_;
            fVar137 = auVar129._20_4_;
            fVar138 = auVar129._24_4_;
            auVar55._4_4_ = fVar158 * fVar158 * fVar158 * auVar113._4_4_ * -0.5;
            auVar55._0_4_ = fVar159 * fVar159 * fVar159 * auVar113._0_4_ * -0.5;
            auVar55._8_4_ = fVar134 * fVar134 * fVar134 * auVar113._8_4_ * -0.5;
            auVar55._12_4_ = fVar135 * fVar135 * fVar135 * auVar113._12_4_ * -0.5;
            auVar55._16_4_ = fVar136 * fVar136 * fVar136 * -0.0;
            auVar55._20_4_ = fVar137 * fVar137 * fVar137 * -0.0;
            auVar55._24_4_ = fVar138 * fVar138 * fVar138 * -0.0;
            auVar55._28_4_ = 0;
            auVar113 = vfmadd231ps_fma(auVar55,auVar246,auVar129);
            fVar159 = auVar113._0_4_;
            fVar158 = auVar113._4_4_;
            auVar56._4_4_ = auVar203._4_4_ * fVar158;
            auVar56._0_4_ = auVar203._0_4_ * fVar159;
            fVar134 = auVar113._8_4_;
            auVar56._8_4_ = auVar203._8_4_ * fVar134;
            fVar135 = auVar113._12_4_;
            auVar56._12_4_ = auVar203._12_4_ * fVar135;
            auVar56._16_4_ = auVar203._16_4_ * 0.0;
            auVar56._20_4_ = auVar203._20_4_ * 0.0;
            auVar56._24_4_ = auVar203._24_4_ * 0.0;
            auVar56._28_4_ = 0;
            auVar57._4_4_ = fVar158 * -auVar149._4_4_;
            auVar57._0_4_ = fVar159 * -auVar149._0_4_;
            auVar57._8_4_ = fVar134 * -auVar149._8_4_;
            auVar57._12_4_ = fVar135 * -auVar149._12_4_;
            auVar57._16_4_ = -auVar149._16_4_ * 0.0;
            auVar57._20_4_ = -auVar149._20_4_ * 0.0;
            auVar57._24_4_ = -auVar149._24_4_ * 0.0;
            auVar57._28_4_ = auVar129._28_4_;
            auVar58._28_4_ = 0xbf000000;
            auVar58._0_28_ =
                 ZEXT1628(CONCAT412(fVar135 * 0.0,
                                    CONCAT48(fVar134 * 0.0,CONCAT44(fVar158 * 0.0,fVar159 * 0.0))));
            auVar113 = vfmadd213ps_fma(auVar52,ZEXT1632(auVar13),local_340);
            auVar129 = ZEXT1632(auVar13);
            auVar141 = vfmadd213ps_fma(auVar53,auVar129,auVar123);
            auVar177 = vfmadd213ps_fma(auVar54,auVar129,ZEXT1632(auVar117));
            auVar186 = vfnmadd213ps_fma(auVar52,auVar129,local_340);
            auVar187 = vfmadd213ps_fma(auVar56,auVar151,_local_5a0);
            auVar194 = vfnmadd213ps_fma(auVar53,auVar129,auVar123);
            auVar112 = vfmadd213ps_fma(auVar57,auVar151,local_580);
            auVar122 = ZEXT1632(auVar13);
            auVar211 = vfnmadd231ps_fma(ZEXT1632(auVar117),auVar122,auVar54);
            auVar117 = vfmadd213ps_fma(auVar58,auVar151,ZEXT1632(auVar160));
            auVar195 = vfnmadd213ps_fma(auVar56,auVar151,_local_5a0);
            auVar196 = vfnmadd213ps_fma(auVar57,auVar151,local_580);
            auVar216 = vfnmadd231ps_fma(ZEXT1632(auVar160),auVar151,auVar58);
            auVar129 = vsubps_avx(ZEXT1632(auVar112),ZEXT1632(auVar194));
            auVar149 = vsubps_avx(ZEXT1632(auVar117),ZEXT1632(auVar211));
            auVar59._4_4_ = auVar129._4_4_ * auVar211._4_4_;
            auVar59._0_4_ = auVar129._0_4_ * auVar211._0_4_;
            auVar59._8_4_ = auVar129._8_4_ * auVar211._8_4_;
            auVar59._12_4_ = auVar129._12_4_ * auVar211._12_4_;
            auVar59._16_4_ = auVar129._16_4_ * 0.0;
            auVar59._20_4_ = auVar129._20_4_ * 0.0;
            auVar59._24_4_ = auVar129._24_4_ * 0.0;
            auVar59._28_4_ = 0;
            auVar140 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar194),auVar149);
            auVar60._4_4_ = auVar186._4_4_ * auVar149._4_4_;
            auVar60._0_4_ = auVar186._0_4_ * auVar149._0_4_;
            auVar60._8_4_ = auVar186._8_4_ * auVar149._8_4_;
            auVar60._12_4_ = auVar186._12_4_ * auVar149._12_4_;
            auVar60._16_4_ = auVar149._16_4_ * 0.0;
            auVar60._20_4_ = auVar149._20_4_ * 0.0;
            auVar60._24_4_ = auVar149._24_4_ * 0.0;
            auVar60._28_4_ = auVar149._28_4_;
            auVar225 = ZEXT1632(auVar186);
            auVar149 = vsubps_avx(ZEXT1632(auVar187),auVar225);
            auVar130 = ZEXT1632(auVar211);
            auVar160 = vfmsub231ps_fma(auVar60,auVar130,auVar149);
            auVar61._4_4_ = auVar194._4_4_ * auVar149._4_4_;
            auVar61._0_4_ = auVar194._0_4_ * auVar149._0_4_;
            auVar61._8_4_ = auVar194._8_4_ * auVar149._8_4_;
            auVar61._12_4_ = auVar194._12_4_ * auVar149._12_4_;
            auVar61._16_4_ = auVar149._16_4_ * 0.0;
            auVar61._20_4_ = auVar149._20_4_ * 0.0;
            auVar61._24_4_ = auVar149._24_4_ * 0.0;
            auVar61._28_4_ = auVar149._28_4_;
            auVar186 = vfmsub231ps_fma(auVar61,auVar225,auVar129);
            auVar160 = vfmadd231ps_fma(ZEXT1632(auVar186),ZEXT832(0) << 0x20,ZEXT1632(auVar160));
            auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),ZEXT832(0) << 0x20,ZEXT1632(auVar140));
            auVar19 = vcmpps_avx(ZEXT1632(auVar160),ZEXT832(0) << 0x20,2);
            auVar129 = vblendvps_avx(ZEXT1632(auVar195),ZEXT1632(auVar113),auVar19);
            auVar149 = vblendvps_avx(ZEXT1632(auVar196),ZEXT1632(auVar141),auVar19);
            local_700 = vblendvps_avx(ZEXT1632(auVar216),ZEXT1632(auVar177),auVar19);
            auVar203 = vblendvps_avx(auVar225,ZEXT1632(auVar187),auVar19);
            auVar121 = vblendvps_avx(ZEXT1632(auVar194),ZEXT1632(auVar112),auVar19);
            auVar206 = vblendvps_avx(auVar130,ZEXT1632(auVar117),auVar19);
            auVar225 = vblendvps_avx(ZEXT1632(auVar187),auVar225,auVar19);
            auVar199 = vblendvps_avx(ZEXT1632(auVar112),ZEXT1632(auVar194),auVar19);
            auVar160 = vpackssdw_avx(local_500._0_16_,local_500._16_16_);
            auVar130 = vblendvps_avx(ZEXT1632(auVar117),auVar130,auVar19);
            auVar225 = vsubps_avx(auVar225,auVar129);
            auVar199 = vsubps_avx(auVar199,auVar149);
            auVar123 = vsubps_avx(auVar130,local_700);
            auVar239 = ZEXT3264(auVar123);
            auVar20 = vsubps_avx(auVar129,auVar203);
            auVar21 = vsubps_avx(auVar149,auVar121);
            auVar22 = vsubps_avx(local_700,auVar206);
            auVar200._0_4_ = auVar123._0_4_ * auVar129._0_4_;
            auVar200._4_4_ = auVar123._4_4_ * auVar129._4_4_;
            auVar200._8_4_ = auVar123._8_4_ * auVar129._8_4_;
            auVar200._12_4_ = auVar123._12_4_ * auVar129._12_4_;
            auVar200._16_4_ = auVar123._16_4_ * auVar129._16_4_;
            auVar200._20_4_ = auVar123._20_4_ * auVar129._20_4_;
            auVar200._24_4_ = auVar123._24_4_ * auVar129._24_4_;
            auVar200._28_4_ = 0;
            auVar117 = vfmsub231ps_fma(auVar200,local_700,auVar225);
            auVar62._4_4_ = auVar225._4_4_ * auVar149._4_4_;
            auVar62._0_4_ = auVar225._0_4_ * auVar149._0_4_;
            auVar62._8_4_ = auVar225._8_4_ * auVar149._8_4_;
            auVar62._12_4_ = auVar225._12_4_ * auVar149._12_4_;
            auVar62._16_4_ = auVar225._16_4_ * auVar149._16_4_;
            auVar62._20_4_ = auVar225._20_4_ * auVar149._20_4_;
            auVar62._24_4_ = auVar225._24_4_ * auVar149._24_4_;
            auVar62._28_4_ = auVar130._28_4_;
            auVar113 = vfmsub231ps_fma(auVar62,auVar129,auVar199);
            auVar117 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT1632(auVar117),_DAT_02020f00);
            auVar201._0_4_ = auVar199._0_4_ * local_700._0_4_;
            auVar201._4_4_ = auVar199._4_4_ * local_700._4_4_;
            auVar201._8_4_ = auVar199._8_4_ * local_700._8_4_;
            auVar201._12_4_ = auVar199._12_4_ * local_700._12_4_;
            auVar201._16_4_ = auVar199._16_4_ * local_700._16_4_;
            auVar201._20_4_ = auVar199._20_4_ * local_700._20_4_;
            auVar201._24_4_ = auVar199._24_4_ * local_700._24_4_;
            auVar201._28_4_ = 0;
            auVar113 = vfmsub231ps_fma(auVar201,auVar149,auVar123);
            auVar113 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT832(0) << 0x20,ZEXT1632(auVar113));
            auVar176 = ZEXT1664(auVar113);
            auVar202._0_4_ = auVar22._0_4_ * auVar203._0_4_;
            auVar202._4_4_ = auVar22._4_4_ * auVar203._4_4_;
            auVar202._8_4_ = auVar22._8_4_ * auVar203._8_4_;
            auVar202._12_4_ = auVar22._12_4_ * auVar203._12_4_;
            auVar202._16_4_ = auVar22._16_4_ * auVar203._16_4_;
            auVar202._20_4_ = auVar22._20_4_ * auVar203._20_4_;
            auVar202._24_4_ = auVar22._24_4_ * auVar203._24_4_;
            auVar202._28_4_ = 0;
            auVar117 = vfmsub231ps_fma(auVar202,auVar20,auVar206);
            auVar63._4_4_ = auVar21._4_4_ * auVar206._4_4_;
            auVar63._0_4_ = auVar21._0_4_ * auVar206._0_4_;
            auVar63._8_4_ = auVar21._8_4_ * auVar206._8_4_;
            auVar63._12_4_ = auVar21._12_4_ * auVar206._12_4_;
            auVar63._16_4_ = auVar21._16_4_ * auVar206._16_4_;
            auVar63._20_4_ = auVar21._20_4_ * auVar206._20_4_;
            auVar63._24_4_ = auVar21._24_4_ * auVar206._24_4_;
            auVar63._28_4_ = auVar206._28_4_;
            auVar141 = vfmsub231ps_fma(auVar63,auVar121,auVar22);
            auVar64._4_4_ = auVar20._4_4_ * auVar121._4_4_;
            auVar64._0_4_ = auVar20._0_4_ * auVar121._0_4_;
            auVar64._8_4_ = auVar20._8_4_ * auVar121._8_4_;
            auVar64._12_4_ = auVar20._12_4_ * auVar121._12_4_;
            auVar64._16_4_ = auVar20._16_4_ * auVar121._16_4_;
            auVar64._20_4_ = auVar20._20_4_ * auVar121._20_4_;
            auVar64._24_4_ = auVar20._24_4_ * auVar121._24_4_;
            auVar64._28_4_ = auVar121._28_4_;
            auVar177 = vfmsub231ps_fma(auVar64,auVar21,auVar203);
            auVar117 = vfmadd231ps_fma(ZEXT1632(auVar177),ZEXT832(0) << 0x20,ZEXT1632(auVar117));
            auVar141 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT832(0) << 0x20,ZEXT1632(auVar141));
            auVar203 = vmaxps_avx(ZEXT1632(auVar113),ZEXT1632(auVar141));
            auVar203 = vcmpps_avx(auVar203,ZEXT832(0) << 0x20,2);
            auVar117 = vpackssdw_avx(auVar203._0_16_,auVar203._16_16_);
            auVar160 = vpand_avx(auVar117,auVar160);
            auVar203 = vpmovsxwd_avx2(auVar160);
            if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar203 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar203 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar203 >> 0x7f,0) == '\0') &&
                  (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar203 >> 0xbf,0) == '\0') &&
                (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar203[0x1f]) {
LAB_016ce2d9:
              auVar226 = ZEXT3264(CONCAT824(uStack_5c8,
                                            CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
            }
            else {
              auVar65._4_4_ = auVar199._4_4_ * auVar22._4_4_;
              auVar65._0_4_ = auVar199._0_4_ * auVar22._0_4_;
              auVar65._8_4_ = auVar199._8_4_ * auVar22._8_4_;
              auVar65._12_4_ = auVar199._12_4_ * auVar22._12_4_;
              auVar65._16_4_ = auVar199._16_4_ * auVar22._16_4_;
              auVar65._20_4_ = auVar199._20_4_ * auVar22._20_4_;
              auVar65._24_4_ = auVar199._24_4_ * auVar22._24_4_;
              auVar65._28_4_ = auVar203._28_4_;
              auVar112 = vfmsub231ps_fma(auVar65,auVar21,auVar123);
              auVar209._0_4_ = auVar123._0_4_ * auVar20._0_4_;
              auVar209._4_4_ = auVar123._4_4_ * auVar20._4_4_;
              auVar209._8_4_ = auVar123._8_4_ * auVar20._8_4_;
              auVar209._12_4_ = auVar123._12_4_ * auVar20._12_4_;
              auVar209._16_4_ = auVar123._16_4_ * auVar20._16_4_;
              auVar209._20_4_ = auVar123._20_4_ * auVar20._20_4_;
              auVar209._24_4_ = auVar123._24_4_ * auVar20._24_4_;
              auVar209._28_4_ = 0;
              auVar187 = vfmsub231ps_fma(auVar209,auVar225,auVar22);
              auVar66._4_4_ = auVar225._4_4_ * auVar21._4_4_;
              auVar66._0_4_ = auVar225._0_4_ * auVar21._0_4_;
              auVar66._8_4_ = auVar225._8_4_ * auVar21._8_4_;
              auVar66._12_4_ = auVar225._12_4_ * auVar21._12_4_;
              auVar66._16_4_ = auVar225._16_4_ * auVar21._16_4_;
              auVar66._20_4_ = auVar225._20_4_ * auVar21._20_4_;
              auVar66._24_4_ = auVar225._24_4_ * auVar21._24_4_;
              auVar66._28_4_ = auVar21._28_4_;
              auVar140 = vfmsub231ps_fma(auVar66,auVar20,auVar199);
              auVar117 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar187),ZEXT1632(auVar140));
              auVar177 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT1632(auVar112),ZEXT832(0) << 0x20);
              auVar203 = vrcpps_avx(ZEXT1632(auVar177));
              auVar238._8_4_ = 0x3f800000;
              auVar238._0_8_ = &DAT_3f8000003f800000;
              auVar238._12_4_ = 0x3f800000;
              auVar238._16_4_ = 0x3f800000;
              auVar238._20_4_ = 0x3f800000;
              auVar238._24_4_ = 0x3f800000;
              auVar238._28_4_ = 0x3f800000;
              auVar239 = ZEXT3264(auVar238);
              auVar117 = vfnmadd213ps_fma(auVar203,ZEXT1632(auVar177),auVar238);
              auVar117 = vfmadd132ps_fma(ZEXT1632(auVar117),auVar203,auVar203);
              auVar183._0_4_ = auVar140._0_4_ * local_700._0_4_;
              auVar183._4_4_ = auVar140._4_4_ * local_700._4_4_;
              auVar183._8_4_ = auVar140._8_4_ * local_700._8_4_;
              auVar183._12_4_ = auVar140._12_4_ * local_700._12_4_;
              auVar183._16_4_ = local_700._16_4_ * 0.0;
              auVar183._20_4_ = local_700._20_4_ * 0.0;
              auVar183._24_4_ = local_700._24_4_ * 0.0;
              auVar183._28_4_ = 0;
              auVar187 = vfmadd231ps_fma(auVar183,ZEXT1632(auVar187),auVar149);
              auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar129,ZEXT1632(auVar112));
              fVar159 = auVar117._0_4_;
              fVar158 = auVar117._4_4_;
              fVar134 = auVar117._8_4_;
              fVar135 = auVar117._12_4_;
              auVar203 = ZEXT1632(CONCAT412(fVar135 * auVar187._12_4_,
                                            CONCAT48(fVar134 * auVar187._8_4_,
                                                     CONCAT44(fVar158 * auVar187._4_4_,
                                                              fVar159 * auVar187._0_4_))));
              uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar184._4_4_ = uVar110;
              auVar184._0_4_ = uVar110;
              auVar184._8_4_ = uVar110;
              auVar184._12_4_ = uVar110;
              auVar184._16_4_ = uVar110;
              auVar184._20_4_ = uVar110;
              auVar184._24_4_ = uVar110;
              auVar184._28_4_ = uVar110;
              auVar98._4_4_ = uStack_13c;
              auVar98._0_4_ = local_140;
              auVar98._8_4_ = uStack_138;
              auVar98._12_4_ = uStack_134;
              auVar98._16_4_ = uStack_130;
              auVar98._20_4_ = uStack_12c;
              auVar98._24_4_ = uStack_128;
              auVar98._28_4_ = uStack_124;
              auVar129 = vcmpps_avx(auVar98,auVar203,2);
              auVar149 = vcmpps_avx(auVar203,auVar184,2);
              auVar129 = vandps_avx(auVar149,auVar129);
              auVar117 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
              auVar160 = vpand_avx(auVar160,auVar117);
              auVar129 = vpmovsxwd_avx2(auVar160);
              if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar129 >> 0x7f,0) == '\0') &&
                    (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar129 >> 0xbf,0) == '\0') &&
                  (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar129[0x1f]) goto LAB_016ce2d9;
              auVar129 = vcmpps_avx(ZEXT1632(auVar177),ZEXT832(0) << 0x20,4);
              auVar117 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
              auVar160 = vpand_avx(auVar160,auVar117);
              auVar129 = vpmovsxwd_avx2(auVar160);
              auVar226 = ZEXT3264(CONCAT824(uStack_5c8,
                                            CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
              if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar129 >> 0x7f,0) != '\0') ||
                    (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar129 >> 0xbf,0) != '\0') ||
                  (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar129[0x1f] < '\0') {
                auVar121 = ZEXT1632(CONCAT412(fVar135 * auVar113._12_4_,
                                              CONCAT48(fVar134 * auVar113._8_4_,
                                                       CONCAT44(fVar158 * auVar113._4_4_,
                                                                fVar159 * auVar113._0_4_))));
                auVar67._28_4_ = SUB84(uStack_5c8,4);
                auVar67._0_28_ =
                     ZEXT1628(CONCAT412(fVar135 * auVar141._12_4_,
                                        CONCAT48(fVar134 * auVar141._8_4_,
                                                 CONCAT44(fVar158 * auVar141._4_4_,
                                                          fVar159 * auVar141._0_4_))));
                auVar219._8_4_ = 0x3f800000;
                auVar219._0_8_ = &DAT_3f8000003f800000;
                auVar219._12_4_ = 0x3f800000;
                auVar219._16_4_ = 0x3f800000;
                auVar219._20_4_ = 0x3f800000;
                auVar219._24_4_ = 0x3f800000;
                auVar219._28_4_ = 0x3f800000;
                auVar149 = vsubps_avx(auVar219,auVar121);
                local_100 = vblendvps_avx(auVar149,auVar121,auVar19);
                auVar149 = vsubps_avx(auVar219,auVar67);
                local_3a0 = vblendvps_avx(auVar149,auVar67,auVar19);
                auVar176 = ZEXT3264(local_3a0);
                auVar226 = ZEXT3264(auVar129);
                local_520 = auVar203;
              }
            }
            auVar231 = ZEXT3264(auVar132);
            auVar129 = auVar226._0_32_;
            if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar129 >> 0x7f,0) == '\0') &&
                  (auVar226 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar129 >> 0xbf,0) == '\0') &&
                (auVar226 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar226[0x1f]) goto LAB_016cdf69;
            auVar149 = vsubps_avx(auVar151,auVar122);
            auVar160 = vfmadd213ps_fma(auVar149,local_100,auVar122);
            fVar159 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar68._4_4_ = (auVar160._4_4_ + auVar160._4_4_) * fVar159;
            auVar68._0_4_ = (auVar160._0_4_ + auVar160._0_4_) * fVar159;
            auVar68._8_4_ = (auVar160._8_4_ + auVar160._8_4_) * fVar159;
            auVar68._12_4_ = (auVar160._12_4_ + auVar160._12_4_) * fVar159;
            auVar68._16_4_ = fVar159 * 0.0;
            auVar68._20_4_ = fVar159 * 0.0;
            auVar68._24_4_ = fVar159 * 0.0;
            auVar68._28_4_ = fVar159;
            auVar149 = vcmpps_avx(local_520,auVar68,6);
            auVar203 = auVar129 & auVar149;
            auVar214 = ZEXT3264(CONCAT428(fStack_744,
                                          CONCAT424(fStack_748,
                                                    CONCAT420(fStack_74c,
                                                              CONCAT416(fStack_750,
                                                                        CONCAT412(fStack_754,
                                                                                  CONCAT48(
                                                  fStack_758,CONCAT44(fStack_75c,local_760))))))));
            auVar220 = ZEXT3264(local_780);
            auVar210 = ZEXT3264(local_740);
            if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar203 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar203 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar203 >> 0x7f,0) != '\0') ||
                  (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar203 >> 0xbf,0) != '\0') ||
                (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar203[0x1f] < '\0') {
              local_420 = vandps_avx(auVar149,auVar129);
              auVar152._8_4_ = 0xbf800000;
              auVar152._0_8_ = 0xbf800000bf800000;
              auVar152._12_4_ = 0xbf800000;
              auVar152._16_4_ = 0xbf800000;
              auVar152._20_4_ = 0xbf800000;
              auVar152._24_4_ = 0xbf800000;
              auVar152._28_4_ = 0xbf800000;
              auVar174._8_4_ = 0x40000000;
              auVar174._0_8_ = 0x4000000040000000;
              auVar174._12_4_ = 0x40000000;
              auVar174._16_4_ = 0x40000000;
              auVar174._20_4_ = 0x40000000;
              auVar174._24_4_ = 0x40000000;
              auVar174._28_4_ = 0x40000000;
              auVar176 = ZEXT3264(auVar174);
              auVar160 = vfmadd213ps_fma(local_3a0,auVar174,auVar152);
              local_4e0 = local_100;
              local_4c0 = ZEXT1632(auVar160);
              local_3a0 = local_4c0;
              auVar129 = local_3a0;
              local_4a0 = local_520;
              pGVar11 = (context->scene->geometries).items[uVar102].ptr;
              if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar159 = (float)local_480;
                local_400[0] = (fVar159 + local_100._0_4_ + 0.0) * local_160;
                local_400[1] = (fVar159 + local_100._4_4_ + 1.0) * fStack_15c;
                local_400[2] = (fVar159 + local_100._8_4_ + 2.0) * fStack_158;
                local_400[3] = (fVar159 + local_100._12_4_ + 3.0) * fStack_154;
                fStack_3f0 = (fVar159 + local_100._16_4_ + 4.0) * fStack_150;
                fStack_3ec = (fVar159 + local_100._20_4_ + 5.0) * fStack_14c;
                fStack_3e8 = (fVar159 + local_100._24_4_ + 6.0) * fStack_148;
                fStack_3e4 = fVar159 + local_100._28_4_ + 7.0;
                local_3a0._0_8_ = auVar160._0_8_;
                local_3a0._8_8_ = auVar160._8_8_;
                local_3e0 = local_3a0._0_8_;
                uStack_3d8 = local_3a0._8_8_;
                uStack_3d0 = 0;
                uStack_3c8 = 0;
                local_3c0 = local_520;
                auVar153._8_4_ = 0x7f800000;
                auVar153._0_8_ = 0x7f8000007f800000;
                auVar153._12_4_ = 0x7f800000;
                auVar153._16_4_ = 0x7f800000;
                auVar153._20_4_ = 0x7f800000;
                auVar153._24_4_ = 0x7f800000;
                auVar153._28_4_ = 0x7f800000;
                auVar149 = vblendvps_avx(auVar153,local_520,local_420);
                auVar203 = vshufps_avx(auVar149,auVar149,0xb1);
                auVar203 = vminps_avx(auVar149,auVar203);
                auVar121 = vshufpd_avx(auVar203,auVar203,5);
                auVar203 = vminps_avx(auVar203,auVar121);
                auVar121 = vpermpd_avx2(auVar203,0x4e);
                auVar203 = vminps_avx(auVar203,auVar121);
                auVar203 = vcmpps_avx(auVar149,auVar203,0);
                auVar121 = local_420 & auVar203;
                auVar149 = local_420;
                if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar121 >> 0x7f,0) != '\0') ||
                      (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar121 >> 0xbf,0) != '\0') ||
                    (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar121[0x1f] < '\0') {
                  auVar149 = vandps_avx(auVar203,local_420);
                }
                uVar104 = vmovmskps_avx(auVar149);
                uVar106 = 0;
                for (; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x80000000) {
                  uVar106 = uVar106 + 1;
                }
                uVar105 = (ulong)uVar106;
                local_3a0 = auVar129;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar159 = local_400[uVar105];
                  fVar158 = 1.0 - fVar159;
                  auVar117 = ZEXT416((uint)fVar159);
                  auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar117,
                                            ZEXT416(0xc0a00000));
                  auVar160 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159 * 3.0)),
                                             ZEXT416((uint)(fVar159 + fVar159)),auVar13);
                  auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar117,
                                            ZEXT416(0x40000000));
                  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * -3.0)),
                                            ZEXT416((uint)(fVar158 + fVar158)),auVar13);
                  auVar113 = vfnmadd231ss_fma(ZEXT416((uint)(fVar159 * (fVar158 + fVar158))),
                                              ZEXT416((uint)fVar158),ZEXT416((uint)fVar158));
                  auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159)),auVar117,
                                             ZEXT416((uint)(fVar158 * -2.0)));
                  fVar158 = auVar13._0_4_ * 0.5;
                  fVar134 = auVar117._0_4_ * 0.5;
                  auVar180._0_4_ = fVar134 * local_7e0;
                  auVar180._4_4_ = fVar134 * fStack_7dc;
                  auVar180._8_4_ = fVar134 * fStack_7d8;
                  auVar180._12_4_ = fVar134 * fStack_7d4;
                  auVar143._4_4_ = fVar158;
                  auVar143._0_4_ = fVar158;
                  auVar143._8_4_ = fVar158;
                  auVar143._12_4_ = fVar158;
                  auVar13 = vfmadd132ps_fma(auVar143,auVar180,auVar14);
                  fVar158 = auVar160._0_4_ * 0.5;
                  auVar181._4_4_ = fVar158;
                  auVar181._0_4_ = fVar158;
                  auVar181._8_4_ = fVar158;
                  auVar181._12_4_ = fVar158;
                  auVar13 = vfmadd132ps_fma(auVar181,auVar13,auVar15);
                  uVar110 = *(undefined4 *)((long)&local_3e0 + uVar105 * 4);
                  fVar158 = auVar113._0_4_ * 0.5;
                  auVar162._4_4_ = fVar158;
                  auVar162._0_4_ = fVar158;
                  auVar162._8_4_ = fVar158;
                  auVar162._12_4_ = fVar158;
                  auVar13 = vfmadd132ps_fma(auVar162,auVar13,auVar16);
                  auVar176 = ZEXT1664(auVar13);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar105 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar13._0_4_;
                  uVar232 = vextractps_avx(auVar13,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar232;
                  uVar232 = vextractps_avx(auVar13,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar232;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar159;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar110;
                  *(uint *)(ray + k * 4 + 0x220) = uVar10;
                  *(uint *)(ray + k * 4 + 0x240) = uVar102;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  local_920 = ZEXT1632(CONCAT88(auVar13._8_8_,uVar105));
                  local_700._0_16_ = auVar18;
                  _local_6a0 = ZEXT1632(auVar115);
                  local_640 = local_420;
                  local_47c = iVar103;
                  local_470 = uVar84;
                  uStack_468 = uVar85;
                  local_460 = uVar86;
                  uStack_458 = uVar87;
                  local_450 = uVar88;
                  uStack_448 = uVar89;
                  local_440 = uVar90;
                  uStack_438 = uVar91;
                  do {
                    auVar149 = local_920;
                    uVar106 = *(uint *)(ray + k * 4 + 0x100);
                    fVar159 = local_400[local_920._0_8_];
                    auVar118._4_4_ = fVar159;
                    auVar118._0_4_ = fVar159;
                    auVar118._8_4_ = fVar159;
                    auVar118._12_4_ = fVar159;
                    local_260._16_4_ = fVar159;
                    local_260._0_16_ = auVar118;
                    local_260._20_4_ = fVar159;
                    local_260._24_4_ = fVar159;
                    local_260._28_4_ = fVar159;
                    uVar110 = *(undefined4 *)((long)&local_3e0 + local_920._0_8_ * 4);
                    local_240._4_4_ = uVar110;
                    local_240._0_4_ = uVar110;
                    local_240._8_4_ = uVar110;
                    local_240._12_4_ = uVar110;
                    local_240._16_4_ = uVar110;
                    local_240._20_4_ = uVar110;
                    local_240._24_4_ = uVar110;
                    local_240._28_4_ = uVar110;
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_3c0 + local_920._0_8_ * 4);
                    fVar158 = 1.0 - fVar159;
                    auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar118,
                                              ZEXT416(0xc0a00000));
                    auVar160 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159 * 3.0)),
                                               ZEXT416((uint)(fVar159 + fVar159)),auVar13);
                    auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar118,
                                              ZEXT416(0x40000000));
                    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * -3.0)),
                                              ZEXT416((uint)(fVar158 + fVar158)),auVar13);
                    auVar113 = vfnmadd231ss_fma(ZEXT416((uint)(fVar159 * (fVar158 + fVar158))),
                                                ZEXT416((uint)fVar158),ZEXT416((uint)fVar158));
                    auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159)),auVar118,
                                               ZEXT416((uint)(fVar158 * -2.0)));
                    fVar159 = auVar13._0_4_ * 0.5;
                    fVar158 = auVar117._0_4_ * 0.5;
                    auVar189._0_4_ = fVar158 * (float)local_6a0._0_4_;
                    auVar189._4_4_ = fVar158 * (float)local_6a0._4_4_;
                    auVar189._8_4_ = fVar158 * (float)uStack_698;
                    auVar189._12_4_ = fVar158 * uStack_698._4_4_;
                    auVar163._4_4_ = fVar159;
                    auVar163._0_4_ = fVar159;
                    auVar163._8_4_ = fVar159;
                    auVar163._12_4_ = fVar159;
                    auVar13 = vfmadd132ps_fma(auVar163,auVar189,local_700._0_16_);
                    fVar159 = auVar160._0_4_ * 0.5;
                    auVar190._4_4_ = fVar159;
                    auVar190._0_4_ = fVar159;
                    auVar190._8_4_ = fVar159;
                    auVar190._12_4_ = fVar159;
                    auVar13 = vfmadd132ps_fma(auVar190,auVar13,auVar17);
                    local_7b0.context = context->user;
                    fVar159 = auVar113._0_4_ * 0.5;
                    auVar164._4_4_ = fVar159;
                    auVar164._0_4_ = fVar159;
                    auVar164._8_4_ = fVar159;
                    auVar164._12_4_ = fVar159;
                    auVar160 = vfmadd132ps_fma(auVar164,auVar13,auVar114);
                    local_2c0 = auVar160._0_4_;
                    uStack_2bc = local_2c0;
                    uStack_2b8 = local_2c0;
                    uStack_2b4 = local_2c0;
                    uStack_2b0 = local_2c0;
                    uStack_2ac = local_2c0;
                    uStack_2a8 = local_2c0;
                    uStack_2a4 = local_2c0;
                    auVar13 = vmovshdup_avx(auVar160);
                    auVar182._0_8_ = auVar13._0_8_;
                    auVar182._8_8_ = auVar182._0_8_;
                    auVar185._16_8_ = auVar182._0_8_;
                    auVar185._0_16_ = auVar182;
                    auVar185._24_8_ = auVar182._0_8_;
                    local_2a0 = auVar185;
                    auVar13 = vshufps_avx(auVar160,auVar160,0xaa);
                    auVar165._0_8_ = auVar13._0_8_;
                    auVar165._8_8_ = auVar165._0_8_;
                    auVar175._16_8_ = auVar165._0_8_;
                    auVar175._0_16_ = auVar165;
                    auVar175._24_8_ = auVar165._0_8_;
                    local_280 = auVar175;
                    local_220 = CONCAT44(uStack_19c,local_1a0);
                    uStack_218 = CONCAT44(uStack_194,uStack_198);
                    uStack_210 = CONCAT44(uStack_18c,uStack_190);
                    uStack_208 = CONCAT44(uStack_184,uStack_188);
                    local_200 = CONCAT44(uStack_17c,local_180);
                    uStack_1f8 = CONCAT44(uStack_174,uStack_178);
                    uStack_1f0 = CONCAT44(uStack_16c,uStack_170);
                    uStack_1e8 = CONCAT44(uStack_164,uStack_168);
                    auVar129 = vpcmpeqd_avx2(local_240,local_240);
                    local_708[1] = auVar129;
                    *local_708 = auVar129;
                    local_1e0 = (local_7b0.context)->instID[0];
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = (local_7b0.context)->instPrimID[0];
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_620 = local_300._0_8_;
                    uStack_618 = local_300._8_8_;
                    uStack_610 = local_300._16_8_;
                    uStack_608 = local_300._24_8_;
                    local_7b0.valid = (int *)&local_620;
                    local_7b0.geometryUserPtr = pGVar11->userPtr;
                    local_7b0.hit = (RTCHitN *)&local_2c0;
                    local_7b0.N = 8;
                    local_7b0.ray = (RTCRayN *)ray;
                    if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar175 = ZEXT1632(auVar165);
                      auVar185 = ZEXT1632(auVar182);
                      (*pGVar11->intersectionFilterN)(&local_7b0);
                      auVar231._8_56_ = extraout_var;
                      auVar231._0_8_ = extraout_XMM1_Qa;
                      auVar220 = ZEXT3264(local_780);
                      auVar129 = vpcmpeqd_avx2(auVar231._0_32_,auVar231._0_32_);
                    }
                    auVar94._8_8_ = uStack_618;
                    auVar94._0_8_ = local_620;
                    auVar94._16_8_ = uStack_610;
                    auVar94._24_8_ = uStack_608;
                    auVar121 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar94);
                    auVar203 = auVar129 & ~auVar121;
                    if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar203 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar203 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar203 >> 0x7f,0) == '\0') &&
                          (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar203 >> 0xbf,0) == '\0') &&
                        (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar203[0x1f]) {
                      auVar121 = auVar121 ^ auVar129;
                      auVar214 = ZEXT3264(CONCAT428(fStack_744,
                                                    CONCAT424(fStack_748,
                                                              CONCAT420(fStack_74c,
                                                                        CONCAT416(fStack_750,
                                                                                  CONCAT412(
                                                  fStack_754,
                                                  CONCAT48(fStack_758,CONCAT44(fStack_75c,local_760)
                                                          )))))));
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar175 = ZEXT1632(auVar175._0_16_);
                        auVar185 = ZEXT1632(auVar185._0_16_);
                        (*p_Var12)(&local_7b0);
                        auVar220 = ZEXT3264(local_780);
                      }
                      auVar95._8_8_ = uStack_618;
                      auVar95._0_8_ = local_620;
                      auVar95._16_8_ = uStack_610;
                      auVar95._24_8_ = uStack_608;
                      auVar203 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95);
                      auVar129 = vpcmpeqd_avx2(auVar185,auVar185);
                      auVar121 = auVar203 ^ auVar129;
                      auVar206 = vpcmpeqd_avx2(auVar175,auVar175);
                      auVar129 = auVar129 & ~auVar203;
                      auVar214 = ZEXT3264(CONCAT428(fStack_744,
                                                    CONCAT424(fStack_748,
                                                              CONCAT420(fStack_74c,
                                                                        CONCAT416(fStack_750,
                                                                                  CONCAT412(
                                                  fStack_754,
                                                  CONCAT48(fStack_758,CONCAT44(fStack_75c,local_760)
                                                          )))))));
                      if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar129 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar129 >> 0x7f,0) != '\0') ||
                            (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar129 >> 0xbf,0) != '\0') ||
                          (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar129[0x1f] < '\0') {
                        auVar203 = auVar203 ^ auVar206;
                        auVar129 = vmaskmovps_avx(auVar203,*(undefined1 (*) [32])local_7b0.hit);
                        *(undefined1 (*) [32])(local_7b0.ray + 0x180) = auVar129;
                        auVar129 = vmaskmovps_avx(auVar203,*(undefined1 (*) [32])
                                                            (local_7b0.hit + 0x20));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x1a0) = auVar129;
                        auVar129 = vmaskmovps_avx(auVar203,*(undefined1 (*) [32])
                                                            (local_7b0.hit + 0x40));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x1c0) = auVar129;
                        auVar129 = vmaskmovps_avx(auVar203,*(undefined1 (*) [32])
                                                            (local_7b0.hit + 0x60));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x1e0) = auVar129;
                        auVar129 = vmaskmovps_avx(auVar203,*(undefined1 (*) [32])
                                                            (local_7b0.hit + 0x80));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x200) = auVar129;
                        auVar129 = vpmaskmovd_avx2(auVar203,*(undefined1 (*) [32])
                                                             (local_7b0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x220) = auVar129;
                        auVar129 = vpmaskmovd_avx2(auVar203,*(undefined1 (*) [32])
                                                             (local_7b0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x240) = auVar129;
                        auVar129 = vpmaskmovd_avx2(auVar203,*(undefined1 (*) [32])
                                                             (local_7b0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x260) = auVar129;
                        auVar129 = vpmaskmovd_avx2(auVar203,*(undefined1 (*) [32])
                                                             (local_7b0.hit + 0x100));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x280) = auVar129;
                      }
                    }
                    auVar129 = local_520;
                    auVar239 = ZEXT464(uVar106);
                    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar121 >> 0x7f,0) == '\0') &&
                          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar121 >> 0xbf,0) == '\0') &&
                        (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar121[0x1f]) {
                      *(uint *)(ray + k * 4 + 0x100) = uVar106;
                    }
                    *(undefined4 *)(local_640 + local_920._0_8_ * 4) = 0;
                    uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
                    auVar131._4_4_ = uVar110;
                    auVar131._0_4_ = uVar110;
                    auVar131._8_4_ = uVar110;
                    auVar131._12_4_ = uVar110;
                    auVar131._16_4_ = uVar110;
                    auVar131._20_4_ = uVar110;
                    auVar131._24_4_ = uVar110;
                    auVar131._28_4_ = uVar110;
                    auVar121 = vcmpps_avx(auVar129,auVar131,2);
                    auVar203 = vandps_avx(auVar121,local_640);
                    auVar121 = local_640 & auVar121;
                    bVar75 = (auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar76 = (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar74 = (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar73 = SUB321(auVar121 >> 0x7f,0) != '\0';
                    bVar72 = (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar71 = SUB321(auVar121 >> 0xbf,0) != '\0';
                    bVar70 = (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar69 = auVar121[0x1f] < '\0';
                    if (((((((bVar75 || bVar76) || bVar74) || bVar73) || bVar72) || bVar71) ||
                        bVar70) || bVar69) {
                      auVar154._8_4_ = 0x7f800000;
                      auVar154._0_8_ = 0x7f8000007f800000;
                      auVar154._12_4_ = 0x7f800000;
                      auVar154._16_4_ = 0x7f800000;
                      auVar154._20_4_ = 0x7f800000;
                      auVar154._24_4_ = 0x7f800000;
                      auVar154._28_4_ = 0x7f800000;
                      auVar129 = vblendvps_avx(auVar154,auVar129,auVar203);
                      auVar121 = vshufps_avx(auVar129,auVar129,0xb1);
                      auVar121 = vminps_avx(auVar129,auVar121);
                      auVar206 = vshufpd_avx(auVar121,auVar121,5);
                      auVar121 = vminps_avx(auVar121,auVar206);
                      auVar206 = vpermpd_avx2(auVar121,0x4e);
                      local_640 = vminps_avx(auVar121,auVar206);
                      auVar121 = vcmpps_avx(auVar129,local_640,0);
                      auVar206 = auVar203 & auVar121;
                      auVar129 = auVar203;
                      if ((((((((auVar206 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar206 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar206 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar206 >> 0x7f,0) != '\0') ||
                            (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar206 >> 0xbf,0) != '\0') ||
                          (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar206[0x1f] < '\0') {
                        auVar129 = vandps_avx(auVar121,auVar203);
                      }
                      uVar106 = vmovmskps_avx(auVar129);
                      local_920._0_4_ = 0;
                      for (; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x80000000) {
                        local_920._0_4_ = local_920._0_4_ + 1;
                      }
                      local_920._4_4_ = 0;
                      local_920._8_24_ = auVar149._8_24_;
                    }
                    auVar176 = ZEXT3264(local_640);
                    local_640 = auVar203;
                  } while (((((((bVar75 || bVar76) || bVar74) || bVar73) || bVar72) || bVar71) ||
                           bVar70) || bVar69);
                }
                auVar210 = ZEXT3264(local_740);
              }
            }
            auVar231 = ZEXT3264(auVar132);
          }
          auVar226 = ZEXT3264(auVar120);
          auVar157 = ZEXT3264(local_6e0);
          lVar109 = lVar109 + 8;
        } while ((int)lVar109 < iVar103);
      }
      uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar116._4_4_ = uVar110;
      auVar116._0_4_ = uVar110;
      auVar116._8_4_ = uVar110;
      auVar116._12_4_ = uVar110;
      auVar13 = vcmpps_avx(local_320,auVar116,2);
      uVar102 = vmovmskps_avx(auVar13);
      uVar102 = (uint)uVar108 & uVar102;
    } while (uVar102 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }